

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void compute_stats_win5_avx2
               (int16_t *d,int32_t d_stride,int16_t *s,int32_t s_stride,int32_t width,int v_start,
               int v_end,int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  undefined1 auVar1 [32];
  __m256i dgd_20;
  __m256i dgd_21;
  __m256i dgd_22;
  __m256i dgd_23;
  __m256i dgd_24;
  __m256i dgd_25;
  __m256i dgd_26;
  __m256i dgd_27;
  __m256i dgd_28;
  __m256i dgd_29;
  __m256i dgd_30;
  __m256i dgd_31;
  __m256i dgd_32;
  __m256i dgd_33;
  __m256i dgd_34;
  __m256i dgd_35;
  __m256i dgd_36;
  __m256i dgd_37;
  __m256i dgd_38;
  __m256i dgd_39;
  __m256i dgd_40;
  __m256i dgd_41;
  __m256i src_00;
  __m256i src_01;
  __m256i src_02;
  __m256i src_03;
  __m256i src1;
  __m256i src_04;
  __m256i src_05;
  __m256i src_06;
  __m256i src_07;
  __m256i src_08;
  __m256i src_09;
  __m256i src_10;
  __m256i src_11;
  __m256i src_12;
  __m256i src_13;
  __m256i src_14;
  __m256i src_15;
  __m256i src1_00;
  __m256i src_16;
  __m256i src_17;
  __m256i src_18;
  __m256i src_19;
  __m256i src_20;
  __m256i src1_01;
  __m256i src_21;
  __m256i src_22;
  __m256i src_23;
  __m256i src_24;
  __m256i src_25;
  __m256i src_26;
  __m256i src0;
  __m256i src0_00;
  __m256i src0_01;
  __m256i src1_02;
  __m256i src1_03;
  __m256i src1_04;
  __m256i src1_05;
  __m256i src1_06;
  __m256i src1_07;
  __m256i src1_08;
  __m256i src1_09;
  __m256i src1_10;
  __m256i src1_11;
  __m256i src1_12;
  __m256i src1_13;
  __m256i src1_14;
  __m256i src1_15;
  __m256i src0_02;
  __m256i src0_03;
  __m256i src0_04;
  __m256i src0_05;
  __m256i src0_06;
  __m256i src0_07;
  __m256i src0_08;
  __m256i src0_09;
  __m256i src0_10;
  __m256i src0_11;
  __m256i src0_12;
  __m256i src0_13;
  __m256i src0_14;
  __m256i src0_15;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  int in_ECX;
  long lVar34;
  long in_RDX;
  longlong extraout_RDX;
  int in_ESI;
  undefined1 *puVar35;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined8 uVar36;
  undefined8 uVar37;
  int64_t iVar38;
  int64_t iVar39;
  undefined8 uVar43;
  undefined8 uVar44;
  int64_t iVar45;
  undefined8 uVar46;
  int64_t iVar47;
  undefined8 uVar48;
  int64_t iVar49;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  __m128i s_00;
  int in_stack_00000008;
  undefined4 in_stack_00000014;
  __m128i s_m_h0_4;
  __m256i s_m_h_5;
  __m256i s_h_5;
  __m256i dgd0_17;
  int g_19;
  __m256i dgd_mul_df_19;
  __m256i dgd_mask_9;
  __m256i dgd_19;
  __m256i dgd0_16;
  int g_18;
  __m256i dgd_mul_df_18;
  __m256i dgd_18;
  __m256i df_reg_9;
  int proc_wd_9;
  __m256i sum_h_5 [5];
  int16_t *d_current_row_4;
  int16_t *d_window_4;
  int proc_ht_5;
  int shift;
  int i_4;
  __m128i s_m_h0_3;
  __m256i s_m_h_4;
  __m256i s_h0_3;
  __m256i dgd0_15;
  int g_17;
  __m256i dgd_mul_df_17;
  __m256i dgd_mask_8;
  __m256i dgd_17;
  __m256i dgd0_14;
  int g_16;
  __m256i dgd_mul_df_16;
  __m256i dgd_16;
  __m256i df_reg_8;
  int proc_wd_8;
  __m256i zero_3;
  __m128i s_h_4;
  __m256i dgd0_13;
  int g_15;
  __m256i dgd_mul_df_15;
  __m256i dgd_mask_7;
  __m256i dgd_15;
  __m256i dgd0_12;
  int g_14;
  __m256i dgd_mul_df_14;
  __m256i dgd_14;
  __m256i df_reg_7;
  int proc_wd_7;
  __m256i sum_h_4 [5];
  int proc_ht_4;
  int16_t *d_current_row_3;
  int16_t *d_window_3;
  int i_3;
  __m128i s_m_h0_2;
  __m256i s_m_h_3;
  __m256i s_h0_2;
  __m256i dgd0_11;
  int g_13;
  __m256i dgd_mul_df_13;
  __m256i dgd_mask_6;
  __m256i dgd_13;
  __m256i dgd0_10;
  int g_12;
  __m256i dgd_mul_df_12;
  __m256i dgd_12;
  __m256i df_reg_6;
  int proc_wd_6;
  __m256i zero_2;
  __m128i s_h_3;
  __m256i dgd0_9;
  int g_11;
  __m256i dgd_mul_df_11;
  __m256i dgd_mask_5;
  __m256i dgd_11;
  __m256i dgd0_8;
  int g_10;
  __m256i dgd_mul_df_10;
  __m256i dgd_10;
  __m256i df_reg_5;
  int proc_wd_5;
  __m256i sum_h_3 [5];
  int proc_ht_3;
  int16_t *d_current_row_2;
  int16_t *d_window_2;
  int i_2;
  __m128i s_m_h0_1;
  __m256i s_m_h_2;
  __m256i s_h0_1;
  __m256i dgd0_7;
  int g_9;
  __m256i dgd_mul_df_9;
  __m256i dgd_mask_4;
  __m256i dgd_9;
  __m256i dgd0_6;
  int g_8;
  __m256i dgd_mul_df_8;
  __m256i dgd_8;
  __m256i df_reg_4;
  int proc_wd_4;
  __m256i zero_1;
  __m256i s_h_2;
  __m256i dgd0_5;
  int g_7;
  __m256i dgd_mul_df_7;
  __m256i dgd_mask_3;
  __m256i dgd_7;
  __m256i dgd0_4;
  int g_6;
  __m256i dgd_mul_df_6;
  __m256i dgd_6;
  __m256i df_reg_3;
  int proc_wd_3;
  __m256i sum_h_2 [5];
  int proc_ht_2;
  int16_t *d_current_row_1;
  int16_t *d_window_1;
  int i_1;
  __m128i s_m_h0;
  __m256i s_m_h_1;
  __m256i s_h0;
  __m256i dgd0_3;
  int g_5;
  __m256i dgd_mul_df_5;
  __m256i dgd_mask_2;
  __m256i dgd_5;
  __m256i dgd0_2;
  int g_4;
  __m256i dgd_mul_df_4;
  __m256i dgd_4;
  __m256i df_reg_2;
  int proc_wd_2;
  __m256i zero;
  __m256i s_h_1;
  __m256i dgd0_1;
  int g_3;
  __m256i dgd_mul_df_3;
  __m256i dgd_mask_1;
  __m256i dgd_3;
  __m256i dgd0;
  int g_2;
  __m256i dgd_mul_df_2;
  __m256i dgd_2;
  __m256i df_reg_1;
  int proc_wd_1;
  __m256i sum_h_1 [5];
  int proc_ht_1;
  int16_t *d_current_row;
  int16_t *d_window;
  int i;
  __m256i s_h;
  __m128i s_m_h;
  __m256i s_m;
  __m256i dgds_0_1;
  int g_1;
  __m256i dgd_mul_df_1;
  __m256i src_mul_df_1;
  __m256i dgd_mask;
  __m256i src_mask;
  __m256i dgd_1;
  __m256i src_1;
  __m256i dgds_0;
  int g;
  __m256i dgd_mul_df;
  __m256i src_mul_df;
  __m256i dgd;
  __m256i src;
  __m256i df_reg;
  int proc_wd;
  int proc_ht;
  __m256i sum_h [5];
  __m256i sum_m [5];
  int16_t *d_t;
  int16_t *s_t;
  int j;
  int downsample_factor;
  __m256i mask;
  int32_t wd_beyond_mul16;
  int32_t wd_mul16;
  int32_t wiener_win2;
  int32_t wiener_win;
  __m256i *in_stack_ffffffffffffd7d0;
  undefined2 in_stack_ffffffffffffd7d8;
  undefined2 in_stack_ffffffffffffd7da;
  ushort uVar50;
  ushort in_stack_ffffffffffffd7dc;
  ushort in_stack_ffffffffffffd7de;
  long in_stack_ffffffffffffd7e0;
  undefined4 in_stack_ffffffffffffd7e8;
  ushort in_stack_ffffffffffffd7ec;
  ushort in_stack_ffffffffffffd7ee;
  long in_stack_ffffffffffffd7f0;
  undefined4 in_stack_ffffffffffffd7f8;
  ushort in_stack_ffffffffffffd7fc;
  ushort in_stack_ffffffffffffd7fe;
  long in_stack_ffffffffffffd800;
  undefined4 in_stack_ffffffffffffd808;
  ushort in_stack_ffffffffffffd80c;
  ushort in_stack_ffffffffffffd80e;
  long in_stack_ffffffffffffd810;
  undefined6 in_stack_ffffffffffffd818;
  undefined8 uVar51;
  __m256i *src3;
  __m256i *src2;
  undefined8 uVar52;
  undefined1 in_stack_ffffffffffffd840 [16];
  longlong in_stack_ffffffffffffd850;
  longlong lVar53;
  undefined8 in_stack_ffffffffffffd858;
  longlong in_stack_ffffffffffffd860;
  undefined8 in_stack_ffffffffffffd868;
  longlong in_stack_ffffffffffffd870;
  int local_2724;
  undefined1 in_stack_ffffffffffffd8e0 [32];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  int local_2684;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  int local_2604;
  int64_t iStack_25f0;
  int64_t iStack_25e8;
  longlong local_2580;
  undefined8 uStack_2578;
  longlong lStack_2570;
  long local_2550;
  long local_2548;
  int local_253c;
  int local_2538;
  int local_2534;
  int local_24a4;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  int local_2404;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  int local_2384;
  int local_2304;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  int local_2264;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  int local_21e4;
  int64_t local_21e0;
  int64_t iStack_21d8;
  int64_t iStack_21d0;
  int64_t iStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  int64_t local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  int local_212c;
  long local_2128;
  long local_2120;
  int local_2114;
  int64_t local_2110;
  undefined8 uStack_2108;
  int64_t local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  int64_t local_20e0;
  int64_t iStack_20d8;
  int64_t iStack_20d0;
  int64_t iStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  int local_2084;
  undefined1 local_2080 [32];
  undefined1 local_2060 [32];
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  int local_1fe4;
  undefined1 local_1fe0 [32];
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined1 local_1fa0 [16];
  undefined1 auStack_1f90 [16];
  int local_1f64;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  int64_t local_1f30;
  int64_t iStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  int local_1ee4;
  undefined1 local_1ee0 [32];
  undefined1 local_1ec0 [32];
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  int local_1e44;
  undefined1 local_1e40 [32];
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined1 local_1e00 [16];
  undefined1 auStack_1df0 [16];
  int local_1dc4;
  int64_t local_1dc0;
  int64_t iStack_1db8;
  int64_t iStack_1db0;
  int64_t iStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  int64_t local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  int local_1d0c;
  long local_1d08;
  long local_1d00;
  int local_1cf4;
  int64_t local_1cf0;
  undefined8 uStack_1ce8;
  int64_t local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  int64_t local_1cc0;
  int64_t iStack_1cb8;
  int64_t iStack_1cb0;
  int64_t iStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  int local_1c64;
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  int local_1bc4;
  undefined1 local_1bc0 [32];
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined1 local_1b80 [16];
  undefined1 auStack_1b70 [16];
  int local_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  int64_t local_1b20;
  int64_t iStack_1b18;
  int64_t iStack_1b10;
  int64_t iStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  int local_1ac4;
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  int local_1a24;
  undefined1 local_1a20 [32];
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined1 local_19e0 [16];
  undefined1 auStack_19d0 [16];
  int local_19a4;
  int64_t local_19a0;
  int64_t iStack_1998;
  int64_t iStack_1990;
  int64_t iStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  int64_t local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  int local_18ec;
  long local_18e8;
  long local_18e0;
  int local_18d4;
  int64_t local_18d0;
  undefined8 uStack_18c8;
  int64_t local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  int64_t local_18a0;
  int64_t iStack_1898;
  int64_t iStack_1890;
  int64_t iStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  int local_1844;
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  int local_17a4;
  undefined1 local_17a0 [32];
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined1 local_1760 [16];
  undefined1 auStack_1750 [16];
  int local_1724;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  int64_t local_1700;
  int64_t iStack_16f8;
  int64_t iStack_16f0;
  int64_t iStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  int local_16a4;
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  int local_1604;
  undefined1 local_1600 [32];
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  int local_1584;
  int64_t local_1580;
  int64_t iStack_1578;
  int64_t iStack_1570;
  int64_t iStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  int64_t local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  int local_14dc;
  long local_14d8;
  long local_14d0;
  int local_14c4;
  int64_t local_14c0;
  int64_t iStack_14b8;
  int64_t iStack_14b0;
  int64_t iStack_14a8;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  int local_1424;
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  int local_1324;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [16];
  undefined1 auStack_1290 [16];
  int local_1268;
  int local_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  long local_1118;
  long local_1110;
  int local_1108;
  uint local_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  int local_10d4;
  uint local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  int local_10c4;
  int local_10bc;
  long local_10b8;
  int local_10ac;
  long local_10a8;
  undefined1 local_10a0 [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  long local_fb8;
  undefined1 (*local_fb0) [32];
  long local_fa8;
  undefined1 (*local_fa0) [32];
  long local_f98;
  undefined1 (*local_f90) [32];
  long local_f88;
  undefined1 (*local_f80) [32];
  long local_f78;
  undefined1 (*local_f70) [32];
  long local_f68;
  undefined1 (*local_f60) [32];
  undefined8 *local_f58;
  undefined1 (*local_f50) [32];
  undefined8 *local_f48;
  undefined1 (*local_f40) [32];
  undefined8 *local_f38;
  undefined1 (*local_f30) [32];
  undefined8 *local_f28;
  undefined1 (*local_f20) [32];
  undefined8 *local_f18;
  undefined1 (*local_f10) [32];
  undefined8 *local_f08;
  undefined1 (*local_f00) [32];
  undefined8 *local_ef8;
  undefined1 (*local_ef0) [32];
  undefined8 *local_ee8;
  undefined1 (*local_ee0) [32];
  undefined8 *local_ed8;
  undefined1 (*local_ed0) [32];
  undefined8 *local_ec8;
  undefined1 (*local_ec0) [32];
  undefined8 *local_eb8;
  undefined1 (*local_eb0) [32];
  undefined8 *local_ea8;
  undefined1 (*local_ea0) [32];
  undefined8 *local_e98;
  undefined1 (*local_e90) [32];
  undefined1 (*local_e88) [32];
  undefined8 *local_e80;
  undefined1 (*local_e78) [32];
  undefined1 (*local_e70) [32];
  int16_t *local_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  ushort local_b94;
  ushort local_b92;
  ushort local_b90;
  ushort local_b8e;
  ushort local_b8c;
  ushort local_b8a;
  ushort local_b88;
  ushort local_b86;
  ushort local_b84;
  ushort local_b82;
  int64_t local_b80;
  int64_t iStack_b78;
  int64_t iStack_b70;
  int64_t iStack_b68;
  int64_t *local_b48;
  int64_t local_b40;
  int64_t iStack_b38;
  int64_t iStack_b30;
  int64_t iStack_b28;
  int64_t *local_b08;
  int64_t local_b00;
  int64_t iStack_af8;
  int64_t iStack_af0;
  int64_t iStack_ae8;
  int64_t *local_ac8;
  int64_t local_ac0;
  int64_t iStack_ab8;
  int64_t iStack_ab0;
  int64_t iStack_aa8;
  int64_t *local_a88;
  int64_t local_a80;
  int64_t iStack_a78;
  int64_t iStack_a70;
  int64_t iStack_a68;
  int64_t *local_a48;
  int64_t local_a40;
  int64_t iStack_a38;
  int64_t iStack_a30;
  int64_t iStack_a28;
  int64_t *local_a08;
  int64_t local_a00;
  int64_t iStack_9f8;
  int64_t iStack_9f0;
  int64_t iStack_9e8;
  int64_t *local_9c8;
  int64_t local_9c0;
  int64_t iStack_9b8;
  int64_t iStack_9b0;
  int64_t iStack_9a8;
  int64_t *local_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 *local_948;
  undefined1 local_940 [32];
  ushort local_920;
  ushort local_91e;
  ushort local_91c;
  ushort local_91a;
  ushort local_918;
  ushort local_916;
  ushort local_914;
  ushort local_912;
  ushort local_910;
  ushort local_90e;
  ushort local_90c;
  ushort local_90a;
  ushort local_908;
  ushort local_906;
  ushort local_904;
  ushort local_902;
  undefined1 local_900 [32];
  ushort local_8e0;
  ushort local_8de;
  ushort local_8dc;
  ushort local_8da;
  ushort local_8d8;
  ushort local_8d6;
  ushort local_8d4;
  ushort local_8d2;
  ushort local_8d0;
  ushort local_8ce;
  ushort local_8cc;
  ushort local_8ca;
  ushort local_8c8;
  ushort local_8c6;
  ushort local_8c4;
  ushort local_8c2;
  undefined1 local_8c0 [32];
  ushort local_8a0;
  ushort local_89e;
  ushort local_89c;
  ushort local_89a;
  ushort local_898;
  ushort local_896;
  ushort local_894;
  ushort local_892;
  ushort local_890;
  ushort local_88e;
  ushort local_88c;
  ushort local_88a;
  ushort local_888;
  ushort local_886;
  ushort local_884;
  ushort local_882;
  undefined1 local_880 [32];
  ushort local_860;
  ushort local_85e;
  ushort local_85c;
  ushort local_85a;
  ushort local_858;
  ushort local_856;
  ushort local_854;
  ushort local_852;
  ushort local_850;
  ushort local_84e;
  ushort local_84c;
  ushort local_84a;
  ushort local_848;
  ushort local_846;
  ushort local_844;
  ushort local_842;
  undefined1 local_840 [32];
  ushort local_820;
  ushort local_81e;
  ushort local_81c;
  ushort local_81a;
  ushort local_818;
  ushort local_816;
  ushort local_814;
  ushort local_812;
  ushort local_810;
  ushort local_80e;
  ushort local_80c;
  ushort local_80a;
  ushort local_808;
  ushort local_806;
  ushort local_804;
  ushort local_802;
  undefined1 local_800 [32];
  ushort local_7e0;
  ushort local_7de;
  ushort local_7dc;
  ushort local_7da;
  ushort local_7d8;
  ushort local_7d6;
  ushort local_7d4;
  ushort local_7d2;
  ushort local_7d0;
  ushort local_7ce;
  ushort local_7cc;
  ushort local_7ca;
  ushort local_7c8;
  ushort local_7c6;
  ushort local_7c4;
  ushort local_7c2;
  undefined1 local_7c0 [32];
  ushort local_7a0;
  ushort local_79e;
  ushort local_79c;
  ushort local_79a;
  ushort local_798;
  ushort local_796;
  ushort local_794;
  ushort local_792;
  ushort local_790;
  ushort local_78e;
  ushort local_78c;
  ushort local_78a;
  ushort local_788;
  ushort local_786;
  ushort local_784;
  ushort local_782;
  undefined1 local_780 [32];
  ushort local_760;
  ushort local_75e;
  ushort local_75c;
  ushort local_75a;
  ushort local_758;
  ushort local_756;
  ushort local_754;
  ushort local_752;
  ushort local_750;
  ushort local_74e;
  ushort local_74c;
  ushort local_74a;
  ushort local_748;
  ushort local_746;
  ushort local_744;
  ushort local_742;
  undefined1 local_740 [32];
  ushort local_720;
  ushort local_71e;
  ushort local_71c;
  ushort local_71a;
  ushort local_718;
  ushort local_716;
  ushort local_714;
  ushort local_712;
  ushort local_710;
  ushort local_70e;
  ushort local_70c;
  ushort local_70a;
  ushort local_708;
  ushort local_706;
  ushort local_704;
  ushort local_702;
  undefined1 local_700 [32];
  ushort local_6e0;
  ushort local_6de;
  ushort local_6dc;
  ushort local_6da;
  ushort local_6d8;
  ushort local_6d6;
  ushort local_6d4;
  ushort local_6d2;
  ushort local_6d0;
  ushort local_6ce;
  ushort local_6cc;
  ushort local_6ca;
  ushort local_6c8;
  ushort local_6c6;
  ushort local_6c4;
  ushort local_6c2;
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  undefined1 auStack_670 [16];
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  undefined1 auStack_570 [16];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 auStack_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [16];
  undefined1 auStack_470 [16];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  undefined1 auStack_430 [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  int64_t local_130;
  int64_t iStack_128;
  int64_t *local_118;
  int64_t local_110;
  int64_t iStack_108;
  int64_t *local_f8;
  longlong local_f0;
  undefined8 uStack_e8;
  longlong *local_d8;
  int64_t local_d0;
  undefined8 uStack_c8;
  int64_t *local_b8;
  int64_t local_b0;
  undefined8 uStack_a8;
  int64_t *local_98;
  int64_t local_90;
  undefined8 uStack_88;
  int64_t *local_78;
  int64_t local_70;
  undefined8 uStack_68;
  int64_t *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 *local_38;
  
  local_10c8 = 5;
  local_10cc = 0x19;
  local_10d0 = in_R8D & 0xfffffff0;
  local_10d4 = in_R8D - local_10d0;
  lVar34 = (long)(0x10 - local_10d4);
  local_e68 = mask_16bit + lVar34;
  local_1100 = *(undefined8 *)local_e68;
  uStack_10f8 = *(undefined8 *)(mask_16bit + lVar34 + 4);
  uStack_10f0 = *(undefined8 *)(mask_16bit + lVar34 + 8);
  uStack_10e8 = *(undefined8 *)(mask_16bit + lVar34 + 0xc);
  local_1108 = 0;
  local_10c4 = in_R9D;
  local_10bc = in_ECX;
  local_10b8 = in_RDX;
  local_10ac = in_ESI;
  local_10a8 = in_RDI;
  do {
    local_1110 = local_10b8;
    local_1118 = local_10a8;
    auVar40._16_16_ = ZEXT816(0) << 0x40;
    local_1140 = ZEXT1632(auVar40._16_16_);
    uVar51 = 0;
    src3 = (__m256i *)0x0;
    src2 = (__m256i *)0x0;
    uVar52 = 0;
    local_11a0 = ZEXT1632(auVar40._16_16_);
    local_fe0 = 0;
    uStack_fd8 = 0;
    uStack_fd0 = 0;
    uStack_fc8 = 0;
    local_11c0 = ZEXT1632(ZEXT816(0));
    local_1240 = ZEXT1632(auVar40._16_16_);
    local_1000 = 0;
    uStack_ff8 = 0;
    uStack_ff0 = 0;
    uStack_fe8 = 0;
    local_1260 = ZEXT1632(ZEXT816(0));
    local_1104 = 1;
    if ((int)H != 0) {
      local_1104 = 4;
    }
    local_1264 = local_10c4;
    local_2580 = in_stack_ffffffffffffd850;
    uStack_2578 = in_stack_ffffffffffffd858;
    lStack_2570 = in_stack_ffffffffffffd870;
    local_1220 = local_1240;
    local_1200 = local_1240;
    local_11e0 = local_1240;
    local_1180 = local_11a0;
    local_1160 = local_11a0;
    do {
      local_1268 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_1264 < 4)) {
        local_1104 = in_stack_00000008 - local_1264;
      }
      local_b82 = (ushort)local_1104;
      local_902 = (ushort)local_1104;
      local_904 = (ushort)local_1104;
      local_906 = (ushort)local_1104;
      local_908 = (ushort)local_1104;
      local_90a = (ushort)local_1104;
      local_90c = (ushort)local_1104;
      local_90e = (ushort)local_1104;
      local_910 = (ushort)local_1104;
      local_912 = (ushort)local_1104;
      local_914 = (ushort)local_1104;
      local_916 = (ushort)local_1104;
      local_918 = (ushort)local_1104;
      local_91a = (ushort)local_1104;
      local_91c = (ushort)local_1104;
      local_91e = (ushort)local_1104;
      local_920 = (ushort)local_1104;
      auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
      auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
      local_940._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
      local_940._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
      uVar50 = (ushort)local_1104;
      local_12a0 = local_940._0_16_;
      auStack_1290 = local_940._16_16_;
      while( true ) {
        if ((int)local_10d0 <= local_1268) break;
        local_e70 = (undefined1 (*) [32])(local_1110 + (long)local_1268 * 2);
        local_12c0 = *(undefined8 *)*local_e70;
        uStack_12b8 = *(undefined8 *)(*local_e70 + 8);
        uStack_12b0 = *(undefined8 *)(*local_e70 + 0x10);
        uStack_12a8 = *(undefined8 *)(*local_e70 + 0x18);
        local_e78 = (undefined1 (*) [32])(local_1118 + (long)local_1268 * 2);
        local_12e0 = *(undefined8 *)*local_e78;
        uStack_12d8 = *(undefined8 *)(*local_e78 + 8);
        uStack_12d0 = *(undefined8 *)(*local_e78 + 0x10);
        uStack_12c8 = *(undefined8 *)(*local_e78 + 0x18);
        auVar33._16_8_ = auStack_1290._0_8_;
        auVar33._0_16_ = local_12a0;
        auVar33._24_8_ = auStack_1290._8_8_;
        local_1300 = vpmullw_avx2(*local_e70,auVar33);
        auVar1._16_8_ = auStack_1290._0_8_;
        auVar1._0_16_ = local_12a0;
        auVar1._24_8_ = auStack_1290._8_8_;
        local_1320 = vpmullw_avx2(*local_e78,auVar1);
        local_1a0 = local_12e0;
        uStack_198 = uStack_12d8;
        uStack_190 = uStack_12d0;
        uStack_188 = uStack_12c8;
        local_160 = local_12c0;
        uStack_158 = uStack_12b8;
        uStack_150 = uStack_12b0;
        uStack_148 = uStack_12a8;
        local_180 = local_12a0;
        auStack_170 = auStack_1290;
        local_1c0 = local_12a0;
        auStack_1b0 = auStack_1290;
        for (local_1324 = 0; local_1324 < 5; local_1324 = local_1324 + 1) {
          local_e80 = (undefined8 *)
                      (local_1118 + (long)local_1108 * 2 + (long)local_1268 * 2 +
                      (long)(local_1324 * local_10ac) * 2);
          local_1360 = *local_e80;
          uStack_1358 = local_e80[1];
          uStack_1350 = local_e80[2];
          uStack_1348 = local_e80[3];
          src_00[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_00[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_00[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_00[1] = in_stack_ffffffffffffd800;
          src_00[2]._0_4_ = in_stack_ffffffffffffd808;
          src_00[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_00[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_00[3] = in_stack_ffffffffffffd810;
          dgd_20[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_20[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_20[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_20[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_20[1] = in_stack_ffffffffffffd7e0;
          dgd_20[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_20[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_20[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_20[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_00,dgd_20,in_stack_ffffffffffffd7d0);
          src_01[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_01[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_01[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_01[1] = in_stack_ffffffffffffd800;
          src_01[2]._0_4_ = in_stack_ffffffffffffd808;
          src_01[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_01[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_01[3] = in_stack_ffffffffffffd810;
          dgd_21[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_21[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_21[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_21[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_21[1] = in_stack_ffffffffffffd7e0;
          dgd_21[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_21[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_21[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_21[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_01,dgd_21,in_stack_ffffffffffffd7d0);
        }
        local_1268 = local_1268 + 0x10;
      }
      if (local_10d4 != 0) {
        local_e88 = (undefined1 (*) [32])(local_1110 + (long)local_1268 * 2);
        local_1380 = *(undefined8 *)*local_e88;
        uStack_1378 = *(undefined8 *)(*local_e88 + 8);
        uStack_1370 = *(undefined8 *)(*local_e88 + 0x10);
        uStack_1368 = *(undefined8 *)(*local_e88 + 0x18);
        local_e90 = (undefined1 (*) [32])(local_1118 + (long)local_1268 * 2);
        local_13a0 = *(undefined8 *)*local_e90;
        uStack_1398 = *(undefined8 *)(*local_e90 + 8);
        uStack_1390 = *(undefined8 *)(*local_e90 + 0x10);
        uStack_1388 = *(undefined8 *)(*local_e90 + 0x18);
        local_be0 = local_1100;
        uStack_bd8 = uStack_10f8;
        uStack_bd0 = uStack_10f0;
        uStack_bc8 = uStack_10e8;
        auVar12._8_8_ = uStack_10f8;
        auVar12._0_8_ = local_1100;
        auVar12._16_8_ = uStack_10f0;
        auVar12._24_8_ = uStack_10e8;
        local_13c0 = vpand_avx2(*local_e88,auVar12);
        local_c20 = local_1100;
        uStack_c18 = uStack_10f8;
        uStack_c10 = uStack_10f0;
        uStack_c08 = uStack_10e8;
        auVar11._8_8_ = uStack_10f8;
        auVar11._0_8_ = local_1100;
        auVar11._16_8_ = uStack_10f0;
        auVar11._24_8_ = uStack_10e8;
        local_13e0 = vpand_avx2(*local_e90,auVar11);
        local_1e0 = local_13c0._0_8_;
        uStack_1d8 = local_13c0._8_8_;
        uStack_1d0 = local_13c0._16_8_;
        uStack_1c8 = local_13c0._24_8_;
        auVar32._16_8_ = auStack_1290._0_8_;
        auVar32._0_16_ = local_12a0;
        auVar32._24_8_ = auStack_1290._8_8_;
        local_1400 = vpmullw_avx2(local_13c0,auVar32);
        local_220 = local_13e0._0_8_;
        uStack_218 = local_13e0._8_8_;
        uStack_210 = local_13e0._16_8_;
        uStack_208 = local_13e0._24_8_;
        auVar31._16_8_ = auStack_1290._0_8_;
        auVar31._0_16_ = local_12a0;
        auVar31._24_8_ = auStack_1290._8_8_;
        local_1420 = vpmullw_avx2(local_13e0,auVar31);
        local_c00 = local_13a0;
        uStack_bf8 = uStack_1398;
        uStack_bf0 = uStack_1390;
        uStack_be8 = uStack_1388;
        local_bc0 = local_1380;
        uStack_bb8 = uStack_1378;
        uStack_bb0 = uStack_1370;
        uStack_ba8 = uStack_1368;
        local_200 = local_12a0;
        auStack_1f0 = auStack_1290;
        local_240 = local_12a0;
        auStack_230 = auStack_1290;
        for (local_1424 = 0; local_1424 < 5; local_1424 = local_1424 + 1) {
          local_e98 = (undefined8 *)
                      (local_1118 + (long)local_1108 * 2 + (long)local_1268 * 2 +
                      (long)(local_1424 * local_10ac) * 2);
          local_1460 = *local_e98;
          uStack_1458 = local_e98[1];
          uStack_1450 = local_e98[2];
          uStack_1448 = local_e98[3];
          src_02[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_02[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_02[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_02[1] = in_stack_ffffffffffffd800;
          src_02[2]._0_4_ = in_stack_ffffffffffffd808;
          src_02[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_02[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_02[3] = in_stack_ffffffffffffd810;
          dgd_22[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_22[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_22[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_22[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_22[1] = in_stack_ffffffffffffd7e0;
          dgd_22[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_22[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_22[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_22[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_02,dgd_22,in_stack_ffffffffffffd7d0);
          src_03[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_03[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_03[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_03[1] = in_stack_ffffffffffffd800;
          src_03[2]._0_4_ = in_stack_ffffffffffffd808;
          src_03[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_03[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_03[3] = in_stack_ffffffffffffd810;
          dgd_23[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_23[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_23[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_23[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_23[1] = in_stack_ffffffffffffd7e0;
          dgd_23[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_23[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_23[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_23[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_03,dgd_23,in_stack_ffffffffffffd7d0);
        }
      }
      local_1264 = local_1104 + local_1264;
      local_1110 = local_1110 + (long)(int)(local_1104 * local_10bc) * 2;
      local_1118 = local_1118 + (long)(int)(local_1104 * local_10ac) * 2;
    } while (local_1264 < in_stack_00000008);
    src0_02[1] = in_stack_ffffffffffffd860;
    src0_02[0] = uStack_2578;
    src0_02[2] = in_stack_ffffffffffffd868;
    src0_02[3] = lStack_2570;
    src1_02[1] = in_stack_ffffffffffffd840._0_8_;
    src1_02[2] = in_stack_ffffffffffffd840._8_8_;
    src1_02[0] = uVar52;
    src1_02[3] = local_2580;
    uVar36 = local_11c0._0_8_;
    uVar43 = local_11c0._8_8_;
    uVar46 = local_11c0._16_8_;
    uVar48 = local_11c0._24_8_;
    hadd_four_32_to_64_avx2(src0_02,src1_02,src2,src3);
    src0[0]._6_2_ = uVar50;
    src0[0]._0_6_ = in_stack_ffffffffffffd818;
    src0[1] = uVar51;
    src0[2] = (longlong)src3;
    src0[3] = (longlong)src2;
    src1[0]._4_2_ = in_stack_ffffffffffffd7fc;
    src1[0]._0_4_ = in_stack_ffffffffffffd7f8;
    src1[0]._6_2_ = in_stack_ffffffffffffd7fe;
    src1[1] = in_stack_ffffffffffffd800;
    src1[2]._0_4_ = in_stack_ffffffffffffd808;
    src1[2]._4_2_ = in_stack_ffffffffffffd80c;
    src1[2]._6_2_ = in_stack_ffffffffffffd80e;
    src1[3] = in_stack_ffffffffffffd810;
    uVar37 = local_1140._0_8_;
    uVar44 = local_1140._8_8_;
    local_1480 = uVar36;
    uStack_1478 = uVar43;
    uStack_1470 = uVar46;
    uStack_1468 = uVar48;
    convert_32_to_64_add_avx2(src0,src1);
    local_948 = (undefined8 *)(CONCAT44(in_stack_00000014,v_end) + (long)(local_1108 * 5) * 8);
    local_980 = local_1480;
    uStack_978 = uStack_1478;
    uStack_970 = uStack_1470;
    uStack_968 = uStack_1468;
    *local_948 = local_1480;
    local_948[1] = uStack_1478;
    local_948[2] = uStack_1470;
    local_948[3] = uStack_1468;
    local_38 = (undefined8 *)(CONCAT44(in_stack_00000014,v_end) + 0x20 + (long)(local_1108 * 5) * 8)
    ;
    *local_38 = uVar37;
    puVar35 = local_1200;
    src0_03[1] = in_stack_ffffffffffffd860;
    src0_03[0] = uStack_2578;
    src0_03[2] = in_stack_ffffffffffffd868;
    src0_03[3] = lStack_2570;
    src1_03[1] = in_stack_ffffffffffffd840._0_8_;
    src1_03[2] = in_stack_ffffffffffffd840._8_8_;
    src1_03[0] = uVar52;
    src1_03[3] = local_2580;
    iVar38 = local_1260._0_8_;
    iVar45 = local_1260._8_8_;
    iVar47 = local_1260._16_8_;
    iVar49 = local_1260._24_8_;
    local_1490 = uVar37;
    uStack_1488 = uVar44;
    local_50 = uVar37;
    uStack_48 = uVar44;
    hadd_four_32_to_64_avx2(src0_03,src1_03,src2,src3);
    local_988 = M + local_1108 * 5;
    *local_988 = iVar38;
    local_988[1] = iVar45;
    local_988[2] = iVar47;
    local_988[3] = iVar49;
    s_00[1] = extraout_RDX;
    s_00[0] = (longlong)puVar35;
    local_14c0 = iVar38;
    iStack_14b8 = iVar45;
    iStack_14b0 = iVar47;
    iStack_14a8 = iVar49;
    local_9c0 = iVar38;
    iStack_9b8 = iVar45;
    iStack_9b0 = iVar47;
    iStack_9a8 = iVar49;
    _mm_storeh_epi64((__m128i *)(M + (local_1108 * 5 + 4)),s_00);
    local_1108 = local_1108 + 1;
    in_stack_ffffffffffffd850 = local_2580;
    in_stack_ffffffffffffd858 = uStack_2578;
    in_stack_ffffffffffffd870 = lStack_2570;
  } while (local_1108 < 5);
  local_14c4 = 1;
  while( true ) {
    if (0x18 < local_14c4) break;
    local_1108 = local_14c4 / 5;
    local_14d0 = local_10a8 + (long)local_1108 * 2;
    in_stack_ffffffffffffd810 = local_10a8 + (long)local_1108 * 2;
    local_14d8 = in_stack_ffffffffffffd810 + (long)((local_14c4 % 5) * local_10ac) * 2;
    local_14dc = local_10c4;
    local_1104 = 1;
    if ((int)H != 0) {
      local_1104 = 4;
    }
    memset(&local_1580,0,0xa0);
    do {
      local_1584 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_14dc < 4)) {
        local_1104 = in_stack_00000008 - local_14dc;
      }
      local_b84 = (ushort)local_1104;
      local_8c2 = (ushort)local_1104;
      local_8c4 = (ushort)local_1104;
      local_8c6 = (ushort)local_1104;
      local_8c8 = (ushort)local_1104;
      local_8ca = (ushort)local_1104;
      local_8cc = (ushort)local_1104;
      local_8ce = (ushort)local_1104;
      local_8d0 = (ushort)local_1104;
      local_8d2 = (ushort)local_1104;
      local_8d4 = (ushort)local_1104;
      local_8d6 = (ushort)local_1104;
      local_8d8 = (ushort)local_1104;
      local_8da = (ushort)local_1104;
      local_8dc = (ushort)local_1104;
      local_8de = (ushort)local_1104;
      local_8e0 = (ushort)local_1104;
      auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
      auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
      local_900._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
      local_900._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
      in_stack_ffffffffffffd80e = (ushort)local_1104;
      local_15c0 = local_900._0_16_;
      auStack_15b0 = local_900._16_16_;
      while( true ) {
        if ((int)local_10d0 <= local_1584) break;
        local_ea0 = (undefined1 (*) [32])(local_14d8 + (long)local_1584 * 2);
        local_15e0 = *(undefined8 *)*local_ea0;
        uStack_15d8 = *(undefined8 *)(*local_ea0 + 8);
        uStack_15d0 = *(undefined8 *)(*local_ea0 + 0x10);
        uStack_15c8 = *(undefined8 *)(*local_ea0 + 0x18);
        auVar30._16_8_ = auStack_15b0._0_8_;
        auVar30._0_16_ = local_15c0;
        auVar30._24_8_ = auStack_15b0._8_8_;
        local_1600 = vpmullw_avx2(*local_ea0,auVar30);
        local_260 = local_15e0;
        uStack_258 = uStack_15d8;
        uStack_250 = uStack_15d0;
        uStack_248 = uStack_15c8;
        local_280 = local_15c0;
        auStack_270 = auStack_15b0;
        for (local_1604 = 0; local_1604 < 4; local_1604 = local_1604 + 1) {
          local_ea8 = (undefined8 *)
                      (local_14d0 + (long)local_1584 * 2 + (long)local_10ac * 2 +
                      (long)(local_1604 * local_10ac) * 2);
          local_1640 = *local_ea8;
          uStack_1638 = local_ea8[1];
          uStack_1630 = local_ea8[2];
          uStack_1628 = local_ea8[3];
          src_04[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_04[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_04[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_04[1] = in_stack_ffffffffffffd800;
          src_04[2]._0_4_ = in_stack_ffffffffffffd808;
          src_04[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_04[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_04[3] = in_stack_ffffffffffffd810;
          dgd_24[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_24[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_24[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_24[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_24[1] = in_stack_ffffffffffffd7e0;
          dgd_24[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_24[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_24[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_24[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_04,dgd_24,in_stack_ffffffffffffd7d0);
        }
        local_1584 = local_1584 + 0x10;
      }
      if (local_10d4 != 0) {
        local_eb0 = (undefined1 (*) [32])(local_14d8 + (long)local_1584 * 2);
        local_1660 = *(undefined8 *)*local_eb0;
        uStack_1658 = *(undefined8 *)(*local_eb0 + 8);
        uStack_1650 = *(undefined8 *)(*local_eb0 + 0x10);
        uStack_1648 = *(undefined8 *)(*local_eb0 + 0x18);
        local_c60 = local_1100;
        uStack_c58 = uStack_10f8;
        uStack_c50 = uStack_10f0;
        uStack_c48 = uStack_10e8;
        auVar10._8_8_ = uStack_10f8;
        auVar10._0_8_ = local_1100;
        auVar10._16_8_ = uStack_10f0;
        auVar10._24_8_ = uStack_10e8;
        local_1680 = vpand_avx2(*local_eb0,auVar10);
        local_2a0 = local_1680._0_8_;
        uStack_298 = local_1680._8_8_;
        uStack_290 = local_1680._16_8_;
        uStack_288 = local_1680._24_8_;
        auVar29._16_8_ = auStack_15b0._0_8_;
        auVar29._0_16_ = local_15c0;
        auVar29._24_8_ = auStack_15b0._8_8_;
        local_16a0 = vpmullw_avx2(local_1680,auVar29);
        local_c40 = local_1660;
        uStack_c38 = uStack_1658;
        uStack_c30 = uStack_1650;
        uStack_c28 = uStack_1648;
        local_2c0 = local_15c0;
        auStack_2b0 = auStack_15b0;
        for (local_16a4 = 0; local_16a4 < 4; local_16a4 = local_16a4 + 1) {
          local_eb8 = (undefined8 *)
                      (local_14d0 + (long)local_1584 * 2 + (long)local_10ac * 2 +
                      (long)(local_16a4 * local_10ac) * 2);
          local_16e0 = *local_eb8;
          uStack_16d8 = local_eb8[1];
          uStack_16d0 = local_eb8[2];
          uStack_16c8 = local_eb8[3];
          src_05[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_05[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_05[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_05[1] = in_stack_ffffffffffffd800;
          src_05[2]._0_4_ = in_stack_ffffffffffffd808;
          src_05[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_05[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_05[3] = in_stack_ffffffffffffd810;
          dgd_25[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_25[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_25[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_25[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_25[1] = in_stack_ffffffffffffd7e0;
          dgd_25[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_25[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_25[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_25[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_05,dgd_25,in_stack_ffffffffffffd7d0);
        }
      }
      local_14dc = local_1104 + local_14dc;
      local_14d0 = local_14d0 + (long)(int)(local_1104 * local_10ac) * 2;
      local_14d8 = local_14d8 + (long)(int)(local_1104 * local_10ac) * 2;
    } while (local_14dc < in_stack_00000008);
    src0_04[1] = in_stack_ffffffffffffd860;
    src0_04[0] = uStack_2578;
    src0_04[2] = in_stack_ffffffffffffd868;
    src0_04[3] = lStack_2570;
    src1_04[1] = in_stack_ffffffffffffd840._0_8_;
    src1_04[2] = in_stack_ffffffffffffd840._8_8_;
    src1_04[0] = uVar52;
    src1_04[3] = local_2580;
    iVar38 = local_1580;
    iVar45 = iStack_1578;
    iVar47 = iStack_1570;
    iVar49 = iStack_1568;
    hadd_four_32_to_64_avx2(src0_04,src1_04,src2,src3);
    local_9c8 = M + (long)(local_14c4 * 0x19) + (long)local_14c4;
    *local_9c8 = iVar38;
    local_9c8[1] = iVar45;
    local_9c8[2] = iVar47;
    local_9c8[3] = iVar49;
    local_1700 = iVar38;
    iStack_16f8 = iVar45;
    iStack_16f0 = iVar47;
    iStack_16e8 = iVar49;
    local_a00 = iVar38;
    iStack_9f8 = iVar45;
    iStack_9f0 = iVar47;
    iStack_9e8 = iVar49;
    while (local_1108 = local_1108 + 1, local_1108 < 5) {
      local_14d0 = local_10a8;
      local_14d8 = local_10a8 + (long)(local_14c4 / 5) * 2 +
                   (long)((local_14c4 % 5) * local_10ac) * 2;
      local_1020 = 0;
      uStack_1018 = 0;
      uStack_1010 = 0;
      uStack_1008 = 0;
      local_1720 = 0;
      uStack_1718 = 0;
      uStack_1710 = 0;
      uStack_1708 = 0;
      local_1580 = 0;
      iStack_1578 = 0;
      iStack_1570 = 0;
      iStack_1568 = 0;
      local_1560 = 0;
      uStack_1558 = 0;
      uStack_1550 = 0;
      uStack_1548 = 0;
      local_1540 = 0;
      uStack_1538 = 0;
      uStack_1530 = 0;
      uStack_1528 = 0;
      local_1520 = 0;
      uStack_1518 = 0;
      uStack_1510 = 0;
      uStack_1508 = 0;
      local_1500 = 0;
      uStack_14f8 = 0;
      uStack_14f0 = 0;
      uStack_14e8 = 0;
      local_14dc = local_10c4;
      local_1104 = 1;
      if ((int)H != 0) {
        local_1104 = 4;
      }
      do {
        local_1724 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_14dc < 4)) {
          local_1104 = in_stack_00000008 - local_14dc;
        }
        local_b86 = (ushort)local_1104;
        local_882 = (ushort)local_1104;
        local_884 = (ushort)local_1104;
        local_886 = (ushort)local_1104;
        local_888 = (ushort)local_1104;
        local_88a = (ushort)local_1104;
        local_88c = (ushort)local_1104;
        local_88e = (ushort)local_1104;
        local_890 = (ushort)local_1104;
        local_892 = (ushort)local_1104;
        local_894 = (ushort)local_1104;
        local_896 = (ushort)local_1104;
        local_898 = (ushort)local_1104;
        local_89a = (ushort)local_1104;
        local_89c = (ushort)local_1104;
        local_89e = (ushort)local_1104;
        local_8a0 = (ushort)local_1104;
        auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
        auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
        local_8c0._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
        local_8c0._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
        in_stack_ffffffffffffd80c = (ushort)local_1104;
        local_1760 = local_8c0._0_16_;
        auStack_1750 = local_8c0._16_16_;
        while( true ) {
          if ((int)local_10d0 <= local_1724) break;
          local_ec0 = (undefined1 (*) [32])(local_14d8 + (long)local_1724 * 2);
          local_1780 = *(undefined8 *)*local_ec0;
          uStack_1778 = *(undefined8 *)(*local_ec0 + 8);
          uStack_1770 = *(undefined8 *)(*local_ec0 + 0x10);
          uStack_1768 = *(undefined8 *)(*local_ec0 + 0x18);
          auVar28._16_8_ = auStack_1750._0_8_;
          auVar28._0_16_ = local_1760;
          auVar28._24_8_ = auStack_1750._8_8_;
          local_17a0 = vpmullw_avx2(*local_ec0,auVar28);
          local_2e0 = local_1780;
          uStack_2d8 = uStack_1778;
          uStack_2d0 = uStack_1770;
          uStack_2c8 = uStack_1768;
          local_300 = local_1760;
          auStack_2f0 = auStack_1750;
          for (local_17a4 = 0; local_17a4 < 5; local_17a4 = local_17a4 + 1) {
            local_ec8 = (undefined8 *)
                        (local_14d0 + (long)local_1108 * 2 + (long)local_1724 * 2 +
                        (long)(local_17a4 * local_10ac) * 2);
            local_17e0 = *local_ec8;
            uStack_17d8 = local_ec8[1];
            uStack_17d0 = local_ec8[2];
            uStack_17c8 = local_ec8[3];
            src_06[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_06[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_06[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_06[1] = in_stack_ffffffffffffd800;
            src_06[2]._0_4_ = in_stack_ffffffffffffd808;
            src_06[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_06[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_06[3] = in_stack_ffffffffffffd810;
            dgd_26[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_26[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_26[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_26[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_26[1] = in_stack_ffffffffffffd7e0;
            dgd_26[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_26[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_26[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_26[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_06,dgd_26,in_stack_ffffffffffffd7d0);
          }
          local_1724 = local_1724 + 0x10;
        }
        if (local_10d4 != 0) {
          local_ed0 = (undefined1 (*) [32])(local_14d8 + (long)local_1724 * 2);
          local_1800 = *(undefined8 *)*local_ed0;
          uStack_17f8 = *(undefined8 *)(*local_ed0 + 8);
          uStack_17f0 = *(undefined8 *)(*local_ed0 + 0x10);
          uStack_17e8 = *(undefined8 *)(*local_ed0 + 0x18);
          local_ca0 = local_1100;
          uStack_c98 = uStack_10f8;
          uStack_c90 = uStack_10f0;
          uStack_c88 = uStack_10e8;
          auVar9._8_8_ = uStack_10f8;
          auVar9._0_8_ = local_1100;
          auVar9._16_8_ = uStack_10f0;
          auVar9._24_8_ = uStack_10e8;
          local_1820 = vpand_avx2(*local_ed0,auVar9);
          local_320 = local_1820._0_8_;
          uStack_318 = local_1820._8_8_;
          uStack_310 = local_1820._16_8_;
          uStack_308 = local_1820._24_8_;
          auVar27._16_8_ = auStack_1750._0_8_;
          auVar27._0_16_ = local_1760;
          auVar27._24_8_ = auStack_1750._8_8_;
          local_1840 = vpmullw_avx2(local_1820,auVar27);
          local_c80 = local_1800;
          uStack_c78 = uStack_17f8;
          uStack_c70 = uStack_17f0;
          uStack_c68 = uStack_17e8;
          local_340 = local_1760;
          auStack_330 = auStack_1750;
          for (local_1844 = 0; local_1844 < 5; local_1844 = local_1844 + 1) {
            local_ed8 = (undefined8 *)
                        (local_14d0 + (long)local_1108 * 2 + (long)local_1724 * 2 +
                        (long)(local_1844 * local_10ac) * 2);
            local_1880 = *local_ed8;
            uStack_1878 = local_ed8[1];
            uStack_1870 = local_ed8[2];
            uStack_1868 = local_ed8[3];
            src_07[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_07[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_07[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_07[1] = in_stack_ffffffffffffd800;
            src_07[2]._0_4_ = in_stack_ffffffffffffd808;
            src_07[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_07[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_07[3] = in_stack_ffffffffffffd810;
            dgd_27[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_27[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_27[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_27[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_27[1] = in_stack_ffffffffffffd7e0;
            dgd_27[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_27[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_27[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_27[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_07,dgd_27,in_stack_ffffffffffffd7d0);
          }
        }
        local_14dc = local_1104 + local_14dc;
        local_14d0 = local_14d0 + (long)(int)(local_1104 * local_10ac) * 2;
        local_14d8 = local_14d8 + (long)(int)(local_1104 * local_10ac) * 2;
      } while (local_14dc < in_stack_00000008);
      src0_05[1] = in_stack_ffffffffffffd860;
      src0_05[0] = uStack_2578;
      src0_05[2] = in_stack_ffffffffffffd868;
      src0_05[3] = lStack_2570;
      src1_05[1] = in_stack_ffffffffffffd840._0_8_;
      src1_05[2] = in_stack_ffffffffffffd840._8_8_;
      src1_05[0] = uVar52;
      src1_05[3] = local_2580;
      iVar38 = local_1580;
      iVar45 = iStack_1578;
      iVar47 = iStack_1570;
      iVar49 = iStack_1568;
      hadd_four_32_to_64_avx2(src0_05,src1_05,src2,src3);
      local_a08 = M + (long)(local_14c4 * 0x19) + (long)(local_1108 * 5);
      *local_a08 = iVar38;
      local_a08[1] = iVar45;
      local_a08[2] = iVar47;
      local_a08[3] = iVar49;
      src_08[0]._4_2_ = in_stack_ffffffffffffd7fc;
      src_08[0]._0_4_ = in_stack_ffffffffffffd7f8;
      src_08[0]._6_2_ = in_stack_ffffffffffffd7fe;
      src_08[1] = in_stack_ffffffffffffd800;
      src_08[2]._0_4_ = in_stack_ffffffffffffd808;
      src_08[2]._4_2_ = in_stack_ffffffffffffd80c;
      src_08[2]._6_2_ = in_stack_ffffffffffffd80e;
      src_08[3] = in_stack_ffffffffffffd810;
      iVar39 = local_1500;
      uVar36 = uStack_14f8;
      uVar43 = uStack_14f0;
      uVar46 = uStack_14e8;
      local_18a0 = iVar38;
      iStack_1898 = iVar45;
      iStack_1890 = iVar47;
      iStack_1888 = iVar49;
      local_a40 = iVar38;
      iStack_a38 = iVar45;
      iStack_a30 = iVar47;
      iStack_a28 = iVar49;
      convert_and_add_avx2(src_08);
      src0_06[1] = in_stack_ffffffffffffd860;
      src0_06[0] = uStack_2578;
      src0_06[2] = in_stack_ffffffffffffd868;
      src0_06[3] = lStack_2570;
      src1_06[1] = in_stack_ffffffffffffd840._0_8_;
      src1_06[2] = in_stack_ffffffffffffd840._8_8_;
      src1_06[0] = uVar52;
      src1_06[3] = local_2580;
      local_18c0 = iVar39;
      uStack_18b8 = uVar36;
      uStack_18b0 = uVar43;
      uStack_18a8 = uVar46;
      add_64bit_lvl_avx2(src0_06,src1_06);
      local_58 = M + (long)(local_14c4 * 0x19) + (long)(local_1108 * 5) + 4;
      *local_58 = iVar39;
      local_18d0 = iVar39;
      uStack_18c8 = uVar36;
      local_70 = iVar39;
      uStack_68 = uVar36;
    }
    local_14c4 = local_14c4 + 5;
  }
  local_18d4 = 2;
  while( true ) {
    if (0x18 < local_18d4) break;
    local_1108 = local_18d4 / 5;
    local_18e0 = local_10a8 + (long)local_1108 * 2;
    in_stack_ffffffffffffd800 = local_10a8 + (long)local_1108 * 2;
    local_18e8 = in_stack_ffffffffffffd800 + (long)((local_18d4 % 5) * local_10ac) * 2;
    local_18ec = local_10c4;
    local_1104 = 1;
    if ((int)H != 0) {
      local_1104 = 4;
    }
    memset(&local_19a0,0,0xa0);
    do {
      local_19a4 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_18ec < 4)) {
        local_1104 = in_stack_00000008 - local_18ec;
      }
      local_b88 = (ushort)local_1104;
      local_842 = (ushort)local_1104;
      local_844 = (ushort)local_1104;
      local_846 = (ushort)local_1104;
      local_848 = (ushort)local_1104;
      local_84a = (ushort)local_1104;
      local_84c = (ushort)local_1104;
      local_84e = (ushort)local_1104;
      local_850 = (ushort)local_1104;
      local_852 = (ushort)local_1104;
      local_854 = (ushort)local_1104;
      local_856 = (ushort)local_1104;
      local_858 = (ushort)local_1104;
      local_85a = (ushort)local_1104;
      local_85c = (ushort)local_1104;
      local_85e = (ushort)local_1104;
      local_860 = (ushort)local_1104;
      auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
      auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
      local_880._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
      local_880._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
      in_stack_ffffffffffffd7fe = (ushort)local_1104;
      local_19e0 = local_880._0_16_;
      auStack_19d0 = local_880._16_16_;
      while( true ) {
        if ((int)local_10d0 <= local_19a4) break;
        local_ee0 = (undefined1 (*) [32])(local_18e8 + (long)local_19a4 * 2);
        local_1a00 = *(undefined8 *)*local_ee0;
        uStack_19f8 = *(undefined8 *)(*local_ee0 + 8);
        uStack_19f0 = *(undefined8 *)(*local_ee0 + 0x10);
        uStack_19e8 = *(undefined8 *)(*local_ee0 + 0x18);
        auVar26._16_8_ = auStack_19d0._0_8_;
        auVar26._0_16_ = local_19e0;
        auVar26._24_8_ = auStack_19d0._8_8_;
        local_1a20 = vpmullw_avx2(*local_ee0,auVar26);
        local_360 = local_1a00;
        uStack_358 = uStack_19f8;
        uStack_350 = uStack_19f0;
        uStack_348 = uStack_19e8;
        local_380 = local_19e0;
        auStack_370 = auStack_19d0;
        for (local_1a24 = 0; local_1a24 < 3; local_1a24 = local_1a24 + 1) {
          local_ee8 = (undefined8 *)
                      (local_18e0 + (long)local_19a4 * 2 + (long)(local_10ac << 1) * 2 +
                      (long)(local_1a24 * local_10ac) * 2);
          local_1a60 = *local_ee8;
          uStack_1a58 = local_ee8[1];
          uStack_1a50 = local_ee8[2];
          uStack_1a48 = local_ee8[3];
          src_09[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_09[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_09[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_09[1] = in_stack_ffffffffffffd800;
          src_09[2]._0_4_ = in_stack_ffffffffffffd808;
          src_09[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_09[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_09[3] = in_stack_ffffffffffffd810;
          dgd_28[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_28[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_28[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_28[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_28[1] = in_stack_ffffffffffffd7e0;
          dgd_28[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_28[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_28[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_28[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_09,dgd_28,in_stack_ffffffffffffd7d0);
        }
        local_19a4 = local_19a4 + 0x10;
      }
      if (local_10d4 != 0) {
        local_ef0 = (undefined1 (*) [32])(local_18e8 + (long)local_19a4 * 2);
        local_1a80 = *(undefined8 *)*local_ef0;
        uStack_1a78 = *(undefined8 *)(*local_ef0 + 8);
        uStack_1a70 = *(undefined8 *)(*local_ef0 + 0x10);
        uStack_1a68 = *(undefined8 *)(*local_ef0 + 0x18);
        local_ce0 = local_1100;
        uStack_cd8 = uStack_10f8;
        uStack_cd0 = uStack_10f0;
        uStack_cc8 = uStack_10e8;
        auVar8._8_8_ = uStack_10f8;
        auVar8._0_8_ = local_1100;
        auVar8._16_8_ = uStack_10f0;
        auVar8._24_8_ = uStack_10e8;
        local_1aa0 = vpand_avx2(*local_ef0,auVar8);
        local_3a0 = local_1aa0._0_8_;
        uStack_398 = local_1aa0._8_8_;
        uStack_390 = local_1aa0._16_8_;
        uStack_388 = local_1aa0._24_8_;
        auVar25._16_8_ = auStack_19d0._0_8_;
        auVar25._0_16_ = local_19e0;
        auVar25._24_8_ = auStack_19d0._8_8_;
        local_1ac0 = vpmullw_avx2(local_1aa0,auVar25);
        local_cc0 = local_1a80;
        uStack_cb8 = uStack_1a78;
        uStack_cb0 = uStack_1a70;
        uStack_ca8 = uStack_1a68;
        local_3c0 = local_19e0;
        auStack_3b0 = auStack_19d0;
        for (local_1ac4 = 0; local_1ac4 < 3; local_1ac4 = local_1ac4 + 1) {
          local_ef8 = (undefined8 *)
                      (local_18e0 + (long)local_19a4 * 2 + (long)(local_10ac << 1) * 2 +
                      (long)(local_1ac4 * local_10ac) * 2);
          local_1b00 = *local_ef8;
          uStack_1af8 = local_ef8[1];
          uStack_1af0 = local_ef8[2];
          uStack_1ae8 = local_ef8[3];
          src_10[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_10[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_10[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_10[1] = in_stack_ffffffffffffd800;
          src_10[2]._0_4_ = in_stack_ffffffffffffd808;
          src_10[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_10[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_10[3] = in_stack_ffffffffffffd810;
          dgd_29[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_29[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_29[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_29[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_29[1] = in_stack_ffffffffffffd7e0;
          dgd_29[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_29[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_29[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_29[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_10,dgd_29,in_stack_ffffffffffffd7d0);
        }
      }
      local_18ec = local_1104 + local_18ec;
      local_18e0 = local_18e0 + (long)(int)(local_1104 * local_10ac) * 2;
      local_18e8 = local_18e8 + (long)(int)(local_1104 * local_10ac) * 2;
    } while (local_18ec < in_stack_00000008);
    src0_07[1] = in_stack_ffffffffffffd860;
    src0_07[0] = uStack_2578;
    src0_07[2] = in_stack_ffffffffffffd868;
    src0_07[3] = lStack_2570;
    src1_07[1] = in_stack_ffffffffffffd840._0_8_;
    src1_07[2] = in_stack_ffffffffffffd840._8_8_;
    src1_07[0] = uVar52;
    src1_07[3] = local_2580;
    iVar38 = local_19a0;
    iVar45 = iStack_1998;
    iVar47 = iStack_1990;
    iVar49 = iStack_1988;
    hadd_four_32_to_64_avx2(src0_07,src1_07,src2,src3);
    local_a48 = M + (long)(local_18d4 * 0x19) + (long)local_18d4;
    *local_a48 = iVar38;
    local_a48[1] = iVar45;
    local_a48[2] = iVar47;
    local_a48[3] = iVar49;
    local_1b20 = iVar38;
    iStack_1b18 = iVar45;
    iStack_1b10 = iVar47;
    iStack_1b08 = iVar49;
    local_a80 = iVar38;
    iStack_a78 = iVar45;
    iStack_a70 = iVar47;
    iStack_a68 = iVar49;
    while (local_1108 = local_1108 + 1, local_1108 < 5) {
      local_18e0 = local_10a8;
      local_18e8 = local_10a8 + (long)(local_18d4 / 5) * 2 +
                   (long)((local_18d4 % 5) * local_10ac) * 2;
      local_1040 = 0;
      uStack_1038 = 0;
      uStack_1030 = 0;
      uStack_1028 = 0;
      local_1b40 = 0;
      uStack_1b38 = 0;
      uStack_1b30 = 0;
      uStack_1b28 = 0;
      local_19a0 = 0;
      iStack_1998 = 0;
      iStack_1990 = 0;
      iStack_1988 = 0;
      local_1980 = 0;
      uStack_1978 = 0;
      uStack_1970 = 0;
      uStack_1968 = 0;
      local_1960 = 0;
      uStack_1958 = 0;
      uStack_1950 = 0;
      uStack_1948 = 0;
      local_1940 = 0;
      uStack_1938 = 0;
      uStack_1930 = 0;
      uStack_1928 = 0;
      local_1920 = 0;
      uStack_1918 = 0;
      uStack_1910 = 0;
      uStack_1908 = 0;
      local_18ec = local_10c4;
      local_1104 = 1;
      if ((int)H != 0) {
        local_1104 = 4;
      }
      do {
        local_1b44 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_18ec < 4)) {
          local_1104 = in_stack_00000008 - local_18ec;
        }
        local_b8a = (ushort)local_1104;
        local_802 = (ushort)local_1104;
        local_804 = (ushort)local_1104;
        local_806 = (ushort)local_1104;
        local_808 = (ushort)local_1104;
        local_80a = (ushort)local_1104;
        local_80c = (ushort)local_1104;
        local_80e = (ushort)local_1104;
        local_810 = (ushort)local_1104;
        local_812 = (ushort)local_1104;
        local_814 = (ushort)local_1104;
        local_816 = (ushort)local_1104;
        local_818 = (ushort)local_1104;
        local_81a = (ushort)local_1104;
        local_81c = (ushort)local_1104;
        local_81e = (ushort)local_1104;
        local_820 = (ushort)local_1104;
        auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
        auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
        local_840._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
        local_840._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
        in_stack_ffffffffffffd7fc = (ushort)local_1104;
        local_1b80 = local_840._0_16_;
        auStack_1b70 = local_840._16_16_;
        while( true ) {
          if ((int)local_10d0 <= local_1b44) break;
          local_f00 = (undefined1 (*) [32])(local_18e8 + (long)local_1b44 * 2);
          local_1ba0 = *(undefined8 *)*local_f00;
          uStack_1b98 = *(undefined8 *)(*local_f00 + 8);
          uStack_1b90 = *(undefined8 *)(*local_f00 + 0x10);
          uStack_1b88 = *(undefined8 *)(*local_f00 + 0x18);
          auVar24._16_8_ = auStack_1b70._0_8_;
          auVar24._0_16_ = local_1b80;
          auVar24._24_8_ = auStack_1b70._8_8_;
          local_1bc0 = vpmullw_avx2(*local_f00,auVar24);
          local_3e0 = local_1ba0;
          uStack_3d8 = uStack_1b98;
          uStack_3d0 = uStack_1b90;
          uStack_3c8 = uStack_1b88;
          local_400 = local_1b80;
          auStack_3f0 = auStack_1b70;
          for (local_1bc4 = 0; local_1bc4 < 5; local_1bc4 = local_1bc4 + 1) {
            local_f08 = (undefined8 *)
                        (local_18e0 + (long)local_1108 * 2 + (long)local_1b44 * 2 +
                        (long)(local_1bc4 * local_10ac) * 2);
            local_1c00 = *local_f08;
            uStack_1bf8 = local_f08[1];
            uStack_1bf0 = local_f08[2];
            uStack_1be8 = local_f08[3];
            src_11[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_11[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_11[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_11[1] = in_stack_ffffffffffffd800;
            src_11[2]._0_4_ = in_stack_ffffffffffffd808;
            src_11[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_11[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_11[3] = in_stack_ffffffffffffd810;
            dgd_30[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_30[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_30[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_30[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_30[1] = in_stack_ffffffffffffd7e0;
            dgd_30[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_30[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_30[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_30[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_11,dgd_30,in_stack_ffffffffffffd7d0);
          }
          local_1b44 = local_1b44 + 0x10;
        }
        if (local_10d4 != 0) {
          local_f10 = (undefined1 (*) [32])(local_18e8 + (long)local_1b44 * 2);
          local_1c20 = *(undefined8 *)*local_f10;
          uStack_1c18 = *(undefined8 *)(*local_f10 + 8);
          uStack_1c10 = *(undefined8 *)(*local_f10 + 0x10);
          uStack_1c08 = *(undefined8 *)(*local_f10 + 0x18);
          local_d20 = local_1100;
          uStack_d18 = uStack_10f8;
          uStack_d10 = uStack_10f0;
          uStack_d08 = uStack_10e8;
          auVar7._8_8_ = uStack_10f8;
          auVar7._0_8_ = local_1100;
          auVar7._16_8_ = uStack_10f0;
          auVar7._24_8_ = uStack_10e8;
          local_1c40 = vpand_avx2(*local_f10,auVar7);
          local_420 = local_1c40._0_8_;
          uStack_418 = local_1c40._8_8_;
          uStack_410 = local_1c40._16_8_;
          uStack_408 = local_1c40._24_8_;
          auVar23._16_8_ = auStack_1b70._0_8_;
          auVar23._0_16_ = local_1b80;
          auVar23._24_8_ = auStack_1b70._8_8_;
          local_1c60 = vpmullw_avx2(local_1c40,auVar23);
          local_d00 = local_1c20;
          uStack_cf8 = uStack_1c18;
          uStack_cf0 = uStack_1c10;
          uStack_ce8 = uStack_1c08;
          local_440 = local_1b80;
          auStack_430 = auStack_1b70;
          for (local_1c64 = 0; local_1c64 < 5; local_1c64 = local_1c64 + 1) {
            local_f18 = (undefined8 *)
                        (local_18e0 + (long)local_1108 * 2 + (long)local_1b44 * 2 +
                        (long)(local_1c64 * local_10ac) * 2);
            local_1ca0 = *local_f18;
            uStack_1c98 = local_f18[1];
            uStack_1c90 = local_f18[2];
            uStack_1c88 = local_f18[3];
            src_12[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_12[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_12[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_12[1] = in_stack_ffffffffffffd800;
            src_12[2]._0_4_ = in_stack_ffffffffffffd808;
            src_12[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_12[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_12[3] = in_stack_ffffffffffffd810;
            dgd_31[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_31[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_31[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_31[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_31[1] = in_stack_ffffffffffffd7e0;
            dgd_31[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_31[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_31[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_31[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_12,dgd_31,in_stack_ffffffffffffd7d0);
          }
        }
        local_18ec = local_1104 + local_18ec;
        local_18e0 = local_18e0 + (long)(int)(local_1104 * local_10ac) * 2;
        local_18e8 = local_18e8 + (long)(int)(local_1104 * local_10ac) * 2;
      } while (local_18ec < in_stack_00000008);
      src0_08[1] = in_stack_ffffffffffffd860;
      src0_08[0] = uStack_2578;
      src0_08[2] = in_stack_ffffffffffffd868;
      src0_08[3] = lStack_2570;
      src1_08[1] = in_stack_ffffffffffffd840._0_8_;
      src1_08[2] = in_stack_ffffffffffffd840._8_8_;
      src1_08[0] = uVar52;
      src1_08[3] = local_2580;
      iVar38 = local_19a0;
      iVar45 = iStack_1998;
      iVar47 = iStack_1990;
      iVar49 = iStack_1988;
      hadd_four_32_to_64_avx2(src0_08,src1_08,src2,src3);
      local_a88 = M + (long)(local_18d4 * 0x19) + (long)(local_1108 * 5);
      *local_a88 = iVar38;
      local_a88[1] = iVar45;
      local_a88[2] = iVar47;
      local_a88[3] = iVar49;
      src_13[0]._4_2_ = in_stack_ffffffffffffd7fc;
      src_13[0]._0_4_ = in_stack_ffffffffffffd7f8;
      src_13[0]._6_2_ = in_stack_ffffffffffffd7fe;
      src_13[1] = in_stack_ffffffffffffd800;
      src_13[2]._0_4_ = in_stack_ffffffffffffd808;
      src_13[2]._4_2_ = in_stack_ffffffffffffd80c;
      src_13[2]._6_2_ = in_stack_ffffffffffffd80e;
      src_13[3] = in_stack_ffffffffffffd810;
      iVar39 = local_1920;
      uVar36 = uStack_1918;
      uVar43 = uStack_1910;
      uVar46 = uStack_1908;
      local_1cc0 = iVar38;
      iStack_1cb8 = iVar45;
      iStack_1cb0 = iVar47;
      iStack_1ca8 = iVar49;
      local_ac0 = iVar38;
      iStack_ab8 = iVar45;
      iStack_ab0 = iVar47;
      iStack_aa8 = iVar49;
      convert_and_add_avx2(src_13);
      src0_09[1] = in_stack_ffffffffffffd860;
      src0_09[0] = uStack_2578;
      src0_09[2] = in_stack_ffffffffffffd868;
      src0_09[3] = lStack_2570;
      src1_09[1] = in_stack_ffffffffffffd840._0_8_;
      src1_09[2] = in_stack_ffffffffffffd840._8_8_;
      src1_09[0] = uVar52;
      src1_09[3] = local_2580;
      local_1ce0 = iVar39;
      uStack_1cd8 = uVar36;
      uStack_1cd0 = uVar43;
      uStack_1cc8 = uVar46;
      add_64bit_lvl_avx2(src0_09,src1_09);
      local_78 = M + (long)(local_18d4 * 0x19) + (long)(local_1108 * 5) + 4;
      *local_78 = iVar39;
      local_1cf0 = iVar39;
      uStack_1ce8 = uVar36;
      local_90 = iVar39;
      uStack_88 = uVar36;
    }
    local_18d4 = local_18d4 + 5;
  }
  local_1cf4 = 3;
  while( true ) {
    if (0x18 < local_1cf4) break;
    local_1108 = local_1cf4 / 5;
    local_1d00 = local_10a8 + (long)local_1108 * 2;
    in_stack_ffffffffffffd7f0 = local_10a8 + (long)local_1108 * 2;
    local_1d08 = in_stack_ffffffffffffd7f0 + (long)((local_1cf4 % 5) * local_10ac) * 2;
    local_1d0c = local_10c4;
    local_1104 = 1;
    if ((int)H != 0) {
      local_1104 = 4;
    }
    memset(&local_1dc0,0,0xa0);
    do {
      local_1dc4 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_1d0c < 4)) {
        local_1104 = in_stack_00000008 - local_1d0c;
      }
      local_b8c = (ushort)local_1104;
      local_7c2 = (ushort)local_1104;
      local_7c4 = (ushort)local_1104;
      local_7c6 = (ushort)local_1104;
      local_7c8 = (ushort)local_1104;
      local_7ca = (ushort)local_1104;
      local_7cc = (ushort)local_1104;
      local_7ce = (ushort)local_1104;
      local_7d0 = (ushort)local_1104;
      local_7d2 = (ushort)local_1104;
      local_7d4 = (ushort)local_1104;
      local_7d6 = (ushort)local_1104;
      local_7d8 = (ushort)local_1104;
      local_7da = (ushort)local_1104;
      local_7dc = (ushort)local_1104;
      local_7de = (ushort)local_1104;
      local_7e0 = (ushort)local_1104;
      auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
      auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
      local_800._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
      local_800._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
      in_stack_ffffffffffffd7ee = (ushort)local_1104;
      local_1e00 = local_800._0_16_;
      auStack_1df0 = local_800._16_16_;
      while( true ) {
        if ((int)local_10d0 <= local_1dc4) break;
        local_f20 = (undefined1 (*) [32])(local_1d08 + (long)local_1dc4 * 2);
        local_1e20 = *(undefined8 *)*local_f20;
        uStack_1e18 = *(undefined8 *)(*local_f20 + 8);
        uStack_1e10 = *(undefined8 *)(*local_f20 + 0x10);
        uStack_1e08 = *(undefined8 *)(*local_f20 + 0x18);
        auVar22._16_8_ = auStack_1df0._0_8_;
        auVar22._0_16_ = local_1e00;
        auVar22._24_8_ = auStack_1df0._8_8_;
        local_1e40 = vpmullw_avx2(*local_f20,auVar22);
        local_460 = local_1e20;
        uStack_458 = uStack_1e18;
        uStack_450 = uStack_1e10;
        uStack_448 = uStack_1e08;
        local_480 = local_1e00;
        auStack_470 = auStack_1df0;
        for (local_1e44 = 0; local_1e44 < 2; local_1e44 = local_1e44 + 1) {
          local_f28 = (undefined8 *)
                      (local_1d00 + (long)local_1dc4 * 2 + (long)(local_10ac * 3) * 2 +
                      (long)(local_1e44 * local_10ac) * 2);
          local_1e80 = *local_f28;
          uStack_1e78 = local_f28[1];
          uStack_1e70 = local_f28[2];
          uStack_1e68 = local_f28[3];
          src_14[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_14[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_14[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_14[1] = in_stack_ffffffffffffd800;
          src_14[2]._0_4_ = in_stack_ffffffffffffd808;
          src_14[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_14[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_14[3] = in_stack_ffffffffffffd810;
          dgd_32[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_32[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_32[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_32[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_32[1] = in_stack_ffffffffffffd7e0;
          dgd_32[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_32[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_32[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_32[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_14,dgd_32,in_stack_ffffffffffffd7d0);
        }
        local_1dc4 = local_1dc4 + 0x10;
      }
      if (local_10d4 != 0) {
        local_f30 = (undefined1 (*) [32])(local_1d08 + (long)local_1dc4 * 2);
        local_1ea0 = *(undefined8 *)*local_f30;
        uStack_1e98 = *(undefined8 *)(*local_f30 + 8);
        uStack_1e90 = *(undefined8 *)(*local_f30 + 0x10);
        uStack_1e88 = *(undefined8 *)(*local_f30 + 0x18);
        local_d60 = local_1100;
        uStack_d58 = uStack_10f8;
        uStack_d50 = uStack_10f0;
        uStack_d48 = uStack_10e8;
        auVar6._8_8_ = uStack_10f8;
        auVar6._0_8_ = local_1100;
        auVar6._16_8_ = uStack_10f0;
        auVar6._24_8_ = uStack_10e8;
        local_1ec0 = vpand_avx2(*local_f30,auVar6);
        local_4a0 = local_1ec0._0_8_;
        uStack_498 = local_1ec0._8_8_;
        uStack_490 = local_1ec0._16_8_;
        uStack_488 = local_1ec0._24_8_;
        auVar21._16_8_ = auStack_1df0._0_8_;
        auVar21._0_16_ = local_1e00;
        auVar21._24_8_ = auStack_1df0._8_8_;
        local_1ee0 = vpmullw_avx2(local_1ec0,auVar21);
        local_d40 = local_1ea0;
        uStack_d38 = uStack_1e98;
        uStack_d30 = uStack_1e90;
        uStack_d28 = uStack_1e88;
        local_4c0 = local_1e00;
        auStack_4b0 = auStack_1df0;
        for (local_1ee4 = 0; local_1ee4 < 2; local_1ee4 = local_1ee4 + 1) {
          local_f38 = (undefined8 *)
                      (local_1d00 + (long)local_1dc4 * 2 + (long)(local_10ac * 3) * 2 +
                      (long)(local_1ee4 * local_10ac) * 2);
          local_1f20 = *local_f38;
          uStack_1f18 = local_f38[1];
          uStack_1f10 = local_f38[2];
          uStack_1f08 = local_f38[3];
          src_15[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_15[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_15[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_15[1] = in_stack_ffffffffffffd800;
          src_15[2]._0_4_ = in_stack_ffffffffffffd808;
          src_15[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_15[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_15[3] = in_stack_ffffffffffffd810;
          dgd_33[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_33[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_33[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_33[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_33[1] = in_stack_ffffffffffffd7e0;
          dgd_33[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_33[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_33[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_33[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_15,dgd_33,in_stack_ffffffffffffd7d0);
        }
      }
      local_1d0c = local_1104 + local_1d0c;
      local_1d00 = local_1d00 + (long)(int)(local_1104 * local_10ac) * 2;
      local_1d08 = local_1d08 + (long)(int)(local_1104 * local_10ac) * 2;
    } while (local_1d0c < in_stack_00000008);
    src0_00[0]._6_2_ = uVar50;
    src0_00[0]._0_6_ = in_stack_ffffffffffffd818;
    src0_00[1] = uVar51;
    src0_00[2] = (longlong)src3;
    src0_00[3] = (longlong)src2;
    src1_00[0]._4_2_ = in_stack_ffffffffffffd7fc;
    src1_00[0]._0_4_ = in_stack_ffffffffffffd7f8;
    src1_00[0]._6_2_ = in_stack_ffffffffffffd7fe;
    src1_00[1] = in_stack_ffffffffffffd800;
    src1_00[2]._0_4_ = in_stack_ffffffffffffd808;
    src1_00[2]._4_2_ = in_stack_ffffffffffffd80c;
    src1_00[2]._6_2_ = in_stack_ffffffffffffd80e;
    src1_00[3] = in_stack_ffffffffffffd810;
    iVar38 = local_1dc0;
    iVar45 = iStack_1db8;
    convert_32_to_64_add_avx2(src0_00,src1_00);
    local_f8 = M + (long)(local_1cf4 * 0x19) + (long)local_1cf4;
    *local_f8 = iVar38;
    local_f8[1] = iVar45;
    local_1f30 = iVar38;
    iStack_1f28 = iVar45;
    local_110 = iVar38;
    iStack_108 = iVar45;
    while (local_1108 = local_1108 + 1, local_1108 < 5) {
      local_1d00 = local_10a8;
      local_1d08 = local_10a8 + (long)(local_1cf4 / 5) * 2 +
                   (long)((local_1cf4 % 5) * local_10ac) * 2;
      local_1060 = 0;
      uStack_1058 = 0;
      uStack_1050 = 0;
      uStack_1048 = 0;
      local_1f60 = 0;
      uStack_1f58 = 0;
      uStack_1f50 = 0;
      uStack_1f48 = 0;
      local_1dc0 = 0;
      iStack_1db8 = 0;
      iStack_1db0 = 0;
      iStack_1da8 = 0;
      local_1da0 = 0;
      uStack_1d98 = 0;
      uStack_1d90 = 0;
      uStack_1d88 = 0;
      local_1d80 = 0;
      uStack_1d78 = 0;
      uStack_1d70 = 0;
      uStack_1d68 = 0;
      local_1d60 = 0;
      uStack_1d58 = 0;
      uStack_1d50 = 0;
      uStack_1d48 = 0;
      local_1d40 = 0;
      uStack_1d38 = 0;
      uStack_1d30 = 0;
      uStack_1d28 = 0;
      local_1d0c = local_10c4;
      local_1104 = 1;
      if ((int)H != 0) {
        local_1104 = 4;
      }
      do {
        local_1f64 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_1d0c < 4)) {
          local_1104 = in_stack_00000008 - local_1d0c;
        }
        local_b8e = (ushort)local_1104;
        local_782 = (ushort)local_1104;
        local_784 = (ushort)local_1104;
        local_786 = (ushort)local_1104;
        local_788 = (ushort)local_1104;
        local_78a = (ushort)local_1104;
        local_78c = (ushort)local_1104;
        local_78e = (ushort)local_1104;
        local_790 = (ushort)local_1104;
        local_792 = (ushort)local_1104;
        local_794 = (ushort)local_1104;
        local_796 = (ushort)local_1104;
        local_798 = (ushort)local_1104;
        local_79a = (ushort)local_1104;
        local_79c = (ushort)local_1104;
        local_79e = (ushort)local_1104;
        local_7a0 = (ushort)local_1104;
        auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
        auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
        local_7c0._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
        local_7c0._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
        in_stack_ffffffffffffd7ec = (ushort)local_1104;
        local_1fa0 = local_7c0._0_16_;
        auStack_1f90 = local_7c0._16_16_;
        while( true ) {
          if ((int)local_10d0 <= local_1f64) break;
          local_f40 = (undefined1 (*) [32])(local_1d08 + (long)local_1f64 * 2);
          local_1fc0 = *(undefined8 *)*local_f40;
          uStack_1fb8 = *(undefined8 *)(*local_f40 + 8);
          uStack_1fb0 = *(undefined8 *)(*local_f40 + 0x10);
          uStack_1fa8 = *(undefined8 *)(*local_f40 + 0x18);
          auVar20._16_8_ = auStack_1f90._0_8_;
          auVar20._0_16_ = local_1fa0;
          auVar20._24_8_ = auStack_1f90._8_8_;
          local_1fe0 = vpmullw_avx2(*local_f40,auVar20);
          local_4e0 = local_1fc0;
          uStack_4d8 = uStack_1fb8;
          uStack_4d0 = uStack_1fb0;
          uStack_4c8 = uStack_1fa8;
          local_500 = local_1fa0;
          auStack_4f0 = auStack_1f90;
          for (local_1fe4 = 0; local_1fe4 < 5; local_1fe4 = local_1fe4 + 1) {
            local_f48 = (undefined8 *)
                        (local_1d00 + (long)local_1108 * 2 + (long)local_1f64 * 2 +
                        (long)(local_1fe4 * local_10ac) * 2);
            local_2020 = *local_f48;
            uStack_2018 = local_f48[1];
            uStack_2010 = local_f48[2];
            uStack_2008 = local_f48[3];
            src_16[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_16[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_16[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_16[1] = in_stack_ffffffffffffd800;
            src_16[2]._0_4_ = in_stack_ffffffffffffd808;
            src_16[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_16[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_16[3] = in_stack_ffffffffffffd810;
            dgd_34[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_34[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_34[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_34[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_34[1] = in_stack_ffffffffffffd7e0;
            dgd_34[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_34[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_34[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_34[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_16,dgd_34,in_stack_ffffffffffffd7d0);
          }
          local_1f64 = local_1f64 + 0x10;
        }
        if (local_10d4 != 0) {
          local_f50 = (undefined1 (*) [32])(local_1d08 + (long)local_1f64 * 2);
          local_2040 = *(undefined8 *)*local_f50;
          uStack_2038 = *(undefined8 *)(*local_f50 + 8);
          uStack_2030 = *(undefined8 *)(*local_f50 + 0x10);
          uStack_2028 = *(undefined8 *)(*local_f50 + 0x18);
          local_da0 = local_1100;
          uStack_d98 = uStack_10f8;
          uStack_d90 = uStack_10f0;
          uStack_d88 = uStack_10e8;
          auVar5._8_8_ = uStack_10f8;
          auVar5._0_8_ = local_1100;
          auVar5._16_8_ = uStack_10f0;
          auVar5._24_8_ = uStack_10e8;
          local_2060 = vpand_avx2(*local_f50,auVar5);
          local_520 = local_2060._0_8_;
          uStack_518 = local_2060._8_8_;
          uStack_510 = local_2060._16_8_;
          uStack_508 = local_2060._24_8_;
          auVar19._16_8_ = auStack_1f90._0_8_;
          auVar19._0_16_ = local_1fa0;
          auVar19._24_8_ = auStack_1f90._8_8_;
          local_2080 = vpmullw_avx2(local_2060,auVar19);
          local_d80 = local_2040;
          uStack_d78 = uStack_2038;
          uStack_d70 = uStack_2030;
          uStack_d68 = uStack_2028;
          local_540 = local_1fa0;
          auStack_530 = auStack_1f90;
          for (local_2084 = 0; local_2084 < 5; local_2084 = local_2084 + 1) {
            local_f58 = (undefined8 *)
                        (local_1d00 + (long)local_1108 * 2 + (long)local_1f64 * 2 +
                        (long)(local_2084 * local_10ac) * 2);
            local_20c0 = *local_f58;
            uStack_20b8 = local_f58[1];
            uStack_20b0 = local_f58[2];
            uStack_20a8 = local_f58[3];
            src_17[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_17[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_17[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_17[1] = in_stack_ffffffffffffd800;
            src_17[2]._0_4_ = in_stack_ffffffffffffd808;
            src_17[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_17[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_17[3] = in_stack_ffffffffffffd810;
            dgd_35[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_35[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_35[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_35[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_35[1] = in_stack_ffffffffffffd7e0;
            dgd_35[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_35[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_35[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_35[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_17,dgd_35,in_stack_ffffffffffffd7d0);
          }
        }
        local_1d0c = local_1104 + local_1d0c;
        local_1d00 = local_1d00 + (long)(int)(local_1104 * local_10ac) * 2;
        local_1d08 = local_1d08 + (long)(int)(local_1104 * local_10ac) * 2;
      } while (local_1d0c < in_stack_00000008);
      src0_10[1] = in_stack_ffffffffffffd860;
      src0_10[0] = uStack_2578;
      src0_10[2] = in_stack_ffffffffffffd868;
      src0_10[3] = lStack_2570;
      src1_10[1] = in_stack_ffffffffffffd840._0_8_;
      src1_10[2] = in_stack_ffffffffffffd840._8_8_;
      src1_10[0] = uVar52;
      src1_10[3] = local_2580;
      iVar38 = local_1dc0;
      iVar45 = iStack_1db8;
      iVar47 = iStack_1db0;
      iVar49 = iStack_1da8;
      hadd_four_32_to_64_avx2(src0_10,src1_10,src2,src3);
      local_ac8 = M + (long)(local_1cf4 * 0x19) + (long)(local_1108 * 5);
      *local_ac8 = iVar38;
      local_ac8[1] = iVar45;
      local_ac8[2] = iVar47;
      local_ac8[3] = iVar49;
      src_18[0]._4_2_ = in_stack_ffffffffffffd7fc;
      src_18[0]._0_4_ = in_stack_ffffffffffffd7f8;
      src_18[0]._6_2_ = in_stack_ffffffffffffd7fe;
      src_18[1] = in_stack_ffffffffffffd800;
      src_18[2]._0_4_ = in_stack_ffffffffffffd808;
      src_18[2]._4_2_ = in_stack_ffffffffffffd80c;
      src_18[2]._6_2_ = in_stack_ffffffffffffd80e;
      src_18[3] = in_stack_ffffffffffffd810;
      iVar39 = local_1d40;
      uVar36 = uStack_1d38;
      uVar43 = uStack_1d30;
      uVar46 = uStack_1d28;
      local_20e0 = iVar38;
      iStack_20d8 = iVar45;
      iStack_20d0 = iVar47;
      iStack_20c8 = iVar49;
      local_b00 = iVar38;
      iStack_af8 = iVar45;
      iStack_af0 = iVar47;
      iStack_ae8 = iVar49;
      convert_and_add_avx2(src_18);
      src0_11[1] = in_stack_ffffffffffffd860;
      src0_11[0] = uStack_2578;
      src0_11[2] = in_stack_ffffffffffffd868;
      src0_11[3] = lStack_2570;
      src1_11[1] = in_stack_ffffffffffffd840._0_8_;
      src1_11[2] = in_stack_ffffffffffffd840._8_8_;
      src1_11[0] = uVar52;
      src1_11[3] = local_2580;
      local_2100 = iVar39;
      uStack_20f8 = uVar36;
      uStack_20f0 = uVar43;
      uStack_20e8 = uVar46;
      add_64bit_lvl_avx2(src0_11,src1_11);
      local_98 = M + (long)(local_1cf4 * 0x19) + (long)(local_1108 * 5) + 4;
      *local_98 = iVar39;
      local_2110 = iVar39;
      uStack_2108 = uVar36;
      local_b0 = iVar39;
      uStack_a8 = uVar36;
    }
    local_1cf4 = local_1cf4 + 5;
  }
  local_2114 = 4;
  while( true ) {
    if (0x18 < local_2114) break;
    local_1108 = local_2114 / 5;
    local_2120 = local_10a8 + (long)local_1108 * 2;
    in_stack_ffffffffffffd7e0 = local_10a8 + (long)local_1108 * 2;
    local_2128 = in_stack_ffffffffffffd7e0 + (long)((local_2114 % 5) * local_10ac) * 2;
    local_212c = local_10c4;
    local_1104 = 1;
    if ((int)H != 0) {
      local_1104 = 4;
    }
    memset(&local_21e0,0,0xa0);
    do {
      local_21e4 = 0;
      if (((int)H != 0) && (in_stack_00000008 - local_212c < 4)) {
        local_1104 = in_stack_00000008 - local_212c;
      }
      local_b90 = (ushort)local_1104;
      local_742 = (ushort)local_1104;
      local_744 = (ushort)local_1104;
      local_746 = (ushort)local_1104;
      local_748 = (ushort)local_1104;
      local_74a = (ushort)local_1104;
      local_74c = (ushort)local_1104;
      local_74e = (ushort)local_1104;
      local_750 = (ushort)local_1104;
      local_752 = (ushort)local_1104;
      local_754 = (ushort)local_1104;
      local_756 = (ushort)local_1104;
      local_758 = (ushort)local_1104;
      local_75a = (ushort)local_1104;
      local_75c = (ushort)local_1104;
      local_75e = (ushort)local_1104;
      local_760 = (ushort)local_1104;
      auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
      auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
      auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
      auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
      auVar40._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
      auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_
      ;
      in_stack_ffffffffffffd7de = (ushort)local_1104;
      local_780 = auVar40;
      while( true ) {
        uStack_2208 = auVar40._24_8_;
        uStack_2210 = auVar40._16_8_;
        if ((int)local_10d0 <= local_21e4) break;
        local_f60 = (undefined1 (*) [32])(local_2128 + (long)local_21e4 * 2);
        local_560 = *(undefined8 *)*local_f60;
        uStack_558 = *(undefined8 *)(*local_f60 + 8);
        uStack_550 = *(undefined8 *)(*local_f60 + 0x10);
        uStack_548 = *(undefined8 *)(*local_f60 + 0x18);
        auVar18._16_8_ = uStack_2210;
        auVar18._0_16_ = auVar40._0_16_;
        auVar18._24_8_ = uStack_2208;
        vpmullw_avx2(*local_f60,auVar18);
        local_580 = auVar40._0_16_;
        auStack_570 = auVar40._16_16_;
        for (local_2264 = 0; local_2264 < 1; local_2264 = local_2264 + 1) {
          local_f68 = local_2120 + (long)local_21e4 * 2 + (long)(local_10ac << 2) * 2 +
                      (long)(local_2264 * local_10ac) * 2;
          src_19[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_19[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_19[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_19[1] = in_stack_ffffffffffffd800;
          src_19[2]._0_4_ = in_stack_ffffffffffffd808;
          src_19[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_19[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_19[3] = in_stack_ffffffffffffd810;
          dgd_36[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_36[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_36[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_36[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_36[1] = in_stack_ffffffffffffd7e0;
          dgd_36[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_36[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_36[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_36[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_19,dgd_36,in_stack_ffffffffffffd7d0);
        }
        local_21e4 = local_21e4 + 0x10;
      }
      if (local_10d4 != 0) {
        local_f70 = (undefined1 (*) [32])(local_2128 + (long)local_21e4 * 2);
        local_dc0 = *(undefined8 *)*local_f70;
        uStack_db8 = *(undefined8 *)(*local_f70 + 8);
        uStack_db0 = *(undefined8 *)(*local_f70 + 0x10);
        uStack_da8 = *(undefined8 *)(*local_f70 + 0x18);
        local_de0 = local_1100;
        uStack_dd8 = uStack_10f8;
        uStack_dd0 = uStack_10f0;
        uStack_dc8 = uStack_10e8;
        auVar4._8_8_ = uStack_10f8;
        auVar4._0_8_ = local_1100;
        auVar4._16_8_ = uStack_10f0;
        auVar4._24_8_ = uStack_10e8;
        auVar1 = vpand_avx2(*local_f70,auVar4);
        local_22e0 = auVar1._0_8_;
        uStack_22d8 = auVar1._8_8_;
        uStack_22d0 = auVar1._16_8_;
        uStack_22c8 = auVar1._24_8_;
        local_5a0 = local_22e0;
        uStack_598 = uStack_22d8;
        uStack_590 = uStack_22d0;
        uStack_588 = uStack_22c8;
        auVar17._16_8_ = uStack_2210;
        auVar17._0_16_ = auVar40._0_16_;
        auVar17._24_8_ = uStack_2208;
        vpmullw_avx2(auVar1,auVar17);
        for (local_2304 = 0; local_5c0 = auVar40._0_16_, auStack_5b0 = auVar40._16_16_,
            local_2304 < 1; local_2304 = local_2304 + 1) {
          local_f78 = local_2120 + (long)local_21e4 * 2 + (long)(local_10ac << 2) * 2 +
                      (long)(local_2304 * local_10ac) * 2;
          src_20[0]._4_2_ = in_stack_ffffffffffffd7fc;
          src_20[0]._0_4_ = in_stack_ffffffffffffd7f8;
          src_20[0]._6_2_ = in_stack_ffffffffffffd7fe;
          src_20[1] = in_stack_ffffffffffffd800;
          src_20[2]._0_4_ = in_stack_ffffffffffffd808;
          src_20[2]._4_2_ = in_stack_ffffffffffffd80c;
          src_20[2]._6_2_ = in_stack_ffffffffffffd80e;
          src_20[3] = in_stack_ffffffffffffd810;
          dgd_37[0]._2_2_ = in_stack_ffffffffffffd7da;
          dgd_37[0]._0_2_ = in_stack_ffffffffffffd7d8;
          dgd_37[0]._4_2_ = in_stack_ffffffffffffd7dc;
          dgd_37[0]._6_2_ = in_stack_ffffffffffffd7de;
          dgd_37[1] = in_stack_ffffffffffffd7e0;
          dgd_37[2]._0_4_ = in_stack_ffffffffffffd7e8;
          dgd_37[2]._4_2_ = in_stack_ffffffffffffd7ec;
          dgd_37[2]._6_2_ = in_stack_ffffffffffffd7ee;
          dgd_37[3] = in_stack_ffffffffffffd7f0;
          madd_and_accum_avx2(src_20,dgd_37,in_stack_ffffffffffffd7d0);
          auVar40._0_16_ = local_5c0;
          auVar40._16_16_ = auStack_5b0;
        }
      }
      local_212c = local_1104 + local_212c;
      local_2120 = local_2120 + (long)(int)(local_1104 * local_10ac) * 2;
      local_2128 = local_2128 + (long)(int)(local_1104 * local_10ac) * 2;
    } while (local_212c < in_stack_00000008);
    src0_01[0]._6_2_ = uVar50;
    src0_01[0]._0_6_ = in_stack_ffffffffffffd818;
    src0_01[1] = uVar51;
    src0_01[2] = (longlong)src3;
    src0_01[3] = (longlong)src2;
    src1_01[0]._4_2_ = in_stack_ffffffffffffd7fc;
    src1_01[0]._0_4_ = in_stack_ffffffffffffd7f8;
    src1_01[0]._6_2_ = in_stack_ffffffffffffd7fe;
    src1_01[1] = in_stack_ffffffffffffd800;
    src1_01[2]._0_4_ = in_stack_ffffffffffffd808;
    src1_01[2]._4_2_ = in_stack_ffffffffffffd80c;
    src1_01[2]._6_2_ = in_stack_ffffffffffffd80e;
    src1_01[3] = in_stack_ffffffffffffd810;
    iVar38 = local_21e0;
    iVar45 = iStack_21d8;
    convert_32_to_64_add_avx2(src0_01,src1_01);
    local_118 = M + (long)(local_2114 * 0x19) + (long)local_2114;
    *local_118 = iVar38;
    local_118[1] = iVar45;
    local_130 = iVar38;
    iStack_128 = iVar45;
    while (local_1108 = local_1108 + 1, local_1108 < 5) {
      local_2120 = local_10a8;
      local_2128 = local_10a8 + (long)(local_2114 / 5) * 2 +
                   (long)((local_2114 % 5) * local_10ac) * 2;
      local_1080 = 0;
      uStack_1078 = 0;
      uStack_1070 = 0;
      uStack_1068 = 0;
      local_21e0 = 0;
      iStack_21d8 = 0;
      iStack_21d0 = 0;
      iStack_21c8 = 0;
      local_21c0 = 0;
      uStack_21b8 = 0;
      uStack_21b0 = 0;
      uStack_21a8 = 0;
      local_21a0 = 0;
      uStack_2198 = 0;
      uStack_2190 = 0;
      uStack_2188 = 0;
      local_2180 = 0;
      uStack_2178 = 0;
      uStack_2170 = 0;
      uStack_2168 = 0;
      local_2160 = 0;
      uStack_2158 = 0;
      uStack_2150 = 0;
      uStack_2148 = 0;
      local_212c = local_10c4;
      local_1104 = 1;
      if ((int)H != 0) {
        local_1104 = 4;
      }
      do {
        local_2384 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_212c < 4)) {
          local_1104 = in_stack_00000008 - local_212c;
        }
        local_b92 = (ushort)local_1104;
        local_702 = (ushort)local_1104;
        local_704 = (ushort)local_1104;
        local_706 = (ushort)local_1104;
        local_708 = (ushort)local_1104;
        local_70a = (ushort)local_1104;
        local_70c = (ushort)local_1104;
        local_70e = (ushort)local_1104;
        local_710 = (ushort)local_1104;
        local_712 = (ushort)local_1104;
        local_714 = (ushort)local_1104;
        local_716 = (ushort)local_1104;
        local_718 = (ushort)local_1104;
        local_71a = (ushort)local_1104;
        local_71c = (ushort)local_1104;
        local_71e = (ushort)local_1104;
        local_720 = (ushort)local_1104;
        auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
        auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
        auVar41._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
        auVar41._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
        in_stack_ffffffffffffd7dc = (ushort)local_1104;
        local_740 = auVar41;
        while( true ) {
          uStack_23a8 = auVar41._24_8_;
          uStack_23b0 = auVar41._16_8_;
          if ((int)local_10d0 <= local_2384) break;
          local_f80 = (undefined1 (*) [32])(local_2128 + (long)local_2384 * 2);
          local_5e0 = *(undefined8 *)*local_f80;
          uStack_5d8 = *(undefined8 *)(*local_f80 + 8);
          uStack_5d0 = *(undefined8 *)(*local_f80 + 0x10);
          uStack_5c8 = *(undefined8 *)(*local_f80 + 0x18);
          auVar16._16_8_ = uStack_23b0;
          auVar16._0_16_ = auVar41._0_16_;
          auVar16._24_8_ = uStack_23a8;
          vpmullw_avx2(*local_f80,auVar16);
          local_600 = auVar41._0_16_;
          auStack_5f0 = auVar41._16_16_;
          for (local_2404 = 0; local_2404 < 5; local_2404 = local_2404 + 1) {
            local_f88 = local_2120 + (long)local_1108 * 2 + (long)local_2384 * 2 +
                        (long)(local_2404 * local_10ac) * 2;
            src_21[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_21[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_21[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_21[1] = in_stack_ffffffffffffd800;
            src_21[2]._0_4_ = in_stack_ffffffffffffd808;
            src_21[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_21[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_21[3] = in_stack_ffffffffffffd810;
            dgd_38[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_38[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_38[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_38[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_38[1] = in_stack_ffffffffffffd7e0;
            dgd_38[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_38[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_38[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_38[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_21,dgd_38,in_stack_ffffffffffffd7d0);
          }
          local_2384 = local_2384 + 0x10;
        }
        if (local_10d4 != 0) {
          local_f90 = (undefined1 (*) [32])(local_2128 + (long)local_2384 * 2);
          local_e00 = *(undefined8 *)*local_f90;
          uStack_df8 = *(undefined8 *)(*local_f90 + 8);
          uStack_df0 = *(undefined8 *)(*local_f90 + 0x10);
          uStack_de8 = *(undefined8 *)(*local_f90 + 0x18);
          local_e20 = local_1100;
          uStack_e18 = uStack_10f8;
          uStack_e10 = uStack_10f0;
          uStack_e08 = uStack_10e8;
          auVar3._8_8_ = uStack_10f8;
          auVar3._0_8_ = local_1100;
          auVar3._16_8_ = uStack_10f0;
          auVar3._24_8_ = uStack_10e8;
          auVar40 = vpand_avx2(*local_f90,auVar3);
          local_2480 = auVar40._0_8_;
          uStack_2478 = auVar40._8_8_;
          uStack_2470 = auVar40._16_8_;
          uStack_2468 = auVar40._24_8_;
          local_620 = local_2480;
          uStack_618 = uStack_2478;
          uStack_610 = uStack_2470;
          uStack_608 = uStack_2468;
          auVar15._16_8_ = uStack_23b0;
          auVar15._0_16_ = auVar41._0_16_;
          auVar15._24_8_ = uStack_23a8;
          vpmullw_avx2(auVar40,auVar15);
          for (local_24a4 = 0; local_640 = auVar41._0_16_, auStack_630 = auVar41._16_16_,
              local_24a4 < 5; local_24a4 = local_24a4 + 1) {
            local_f98 = local_2120 + (long)local_1108 * 2 + (long)local_2384 * 2 +
                        (long)(local_24a4 * local_10ac) * 2;
            src_22[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_22[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_22[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_22[1] = in_stack_ffffffffffffd800;
            src_22[2]._0_4_ = in_stack_ffffffffffffd808;
            src_22[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_22[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_22[3] = in_stack_ffffffffffffd810;
            dgd_39[0]._2_2_ = in_stack_ffffffffffffd7da;
            dgd_39[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_39[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_39[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_39[1] = in_stack_ffffffffffffd7e0;
            dgd_39[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_39[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_39[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_39[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_22,dgd_39,in_stack_ffffffffffffd7d0);
            auVar41._0_16_ = local_640;
            auVar41._16_16_ = auStack_630;
          }
        }
        local_212c = local_1104 + local_212c;
        local_2120 = local_2120 + (long)(int)(local_1104 * local_10ac) * 2;
        local_2128 = local_2128 + (long)(int)(local_1104 * local_10ac) * 2;
      } while (local_212c < in_stack_00000008);
      src0_12[1] = in_stack_ffffffffffffd860;
      src0_12[0] = uStack_2578;
      src0_12[2] = in_stack_ffffffffffffd868;
      src0_12[3] = lStack_2570;
      src1_12[1] = in_stack_ffffffffffffd840._0_8_;
      src1_12[2] = in_stack_ffffffffffffd840._8_8_;
      src1_12[0] = uVar52;
      src1_12[3] = local_2580;
      iVar38 = local_21e0;
      iVar45 = iStack_21d8;
      iVar47 = iStack_21d0;
      iVar49 = iStack_21c8;
      hadd_four_32_to_64_avx2(src0_12,src1_12,src2,src3);
      local_b08 = M + (long)(local_2114 * 0x19) + (long)(local_1108 * 5);
      *local_b08 = iVar38;
      local_b08[1] = iVar45;
      local_b08[2] = iVar47;
      local_b08[3] = iVar49;
      src_23[0]._4_2_ = in_stack_ffffffffffffd7fc;
      src_23[0]._0_4_ = in_stack_ffffffffffffd7f8;
      src_23[0]._6_2_ = in_stack_ffffffffffffd7fe;
      src_23[1] = in_stack_ffffffffffffd800;
      src_23[2]._0_4_ = in_stack_ffffffffffffd808;
      src_23[2]._4_2_ = in_stack_ffffffffffffd80c;
      src_23[2]._6_2_ = in_stack_ffffffffffffd80e;
      src_23[3] = in_stack_ffffffffffffd810;
      iVar39 = local_2160;
      uVar36 = uStack_2158;
      local_b40 = iVar38;
      iStack_b38 = iVar45;
      iStack_b30 = iVar47;
      iStack_b28 = iVar49;
      convert_and_add_avx2(src_23);
      src0_13[1] = in_stack_ffffffffffffd860;
      src0_13[0] = uStack_2578;
      src0_13[2] = in_stack_ffffffffffffd868;
      src0_13[3] = lStack_2570;
      src1_13[1] = in_stack_ffffffffffffd840._0_8_;
      src1_13[2] = in_stack_ffffffffffffd840._8_8_;
      src1_13[0] = uVar52;
      src1_13[3] = local_2580;
      add_64bit_lvl_avx2(src0_13,src1_13);
      local_b8 = M + (long)(local_2114 * 0x19) + (long)(local_1108 * 5) + 4;
      *local_b8 = iVar39;
      local_d0 = iVar39;
      uStack_c8 = uVar36;
    }
    local_2114 = local_2114 + 5;
  }
  for (local_2534 = 5; local_2534 < 0x19; local_2534 = local_2534 + 5) {
    local_1108 = local_2534 / 5;
    local_2538 = 0;
    lVar53 = local_2580;
    do {
      local_253c = local_10c4;
      local_2548 = local_10a8 + (long)(local_2534 / 5) * 2;
      local_2550 = local_10a8 + (long)(local_2534 / 5) * 2 +
                   (long)((local_2534 % 5) * local_10ac) * 2;
      local_1104 = (uint)((int)H != 0) * 3 + 1;
      local_2580 = 0;
      local_10a0 = ZEXT432(0) << 0x40;
      iVar38 = 0;
      iVar45 = 0;
      uVar51 = uStack_2578;
      do {
        local_2604 = 0;
        if (((int)H != 0) && (in_stack_00000008 - local_253c < 4)) {
          local_1104 = in_stack_00000008 - local_253c;
        }
        local_b94 = (ushort)local_1104;
        local_6c2 = (ushort)local_1104;
        local_6c4 = (ushort)local_1104;
        local_6c6 = (ushort)local_1104;
        local_6c8 = (ushort)local_1104;
        local_6ca = (ushort)local_1104;
        local_6cc = (ushort)local_1104;
        local_6ce = (ushort)local_1104;
        local_6d0 = (ushort)local_1104;
        local_6d2 = (ushort)local_1104;
        local_6d4 = (ushort)local_1104;
        local_6d6 = (ushort)local_1104;
        local_6d8 = (ushort)local_1104;
        local_6da = (ushort)local_1104;
        local_6dc = (ushort)local_1104;
        local_6de = (ushort)local_1104;
        local_6e0 = (ushort)local_1104;
        auVar40._16_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,2);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,3);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,4);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,5);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,6);
        auVar40._16_16_ = vpinsrw_avx(auVar40._16_16_,local_1104 & 0xffff,7);
        auVar40._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1104),local_1104 & 0xffff,1);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,2);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,3);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,4);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,5);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,6);
        auVar40._0_16_ = vpinsrw_avx(auVar40._0_16_,local_1104 & 0xffff,7);
        auVar42._0_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar40._0_16_;
        auVar42._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40._16_16_;
        uVar50 = (ushort)local_1104;
        local_700 = auVar42;
        while( true ) {
          uStack_2628 = auVar42._24_8_;
          uStack_2630 = auVar42._16_8_;
          if ((int)local_10d0 <= local_2604) break;
          local_fa0 = (undefined1 (*) [32])(local_2550 + (long)local_2604 * 2);
          local_660 = *(undefined8 *)*local_fa0;
          uStack_658 = *(undefined8 *)(*local_fa0 + 8);
          uStack_650 = *(undefined8 *)(*local_fa0 + 0x10);
          uStack_648 = *(undefined8 *)(*local_fa0 + 0x18);
          auVar14._16_8_ = uStack_2630;
          auVar14._0_16_ = auVar42._0_16_;
          auVar14._24_8_ = uStack_2628;
          vpmullw_avx2(*local_fa0,auVar14);
          local_680 = auVar42._0_16_;
          auStack_670 = auVar42._16_16_;
          for (local_2684 = 0; local_2684 < 5; local_2684 = local_2684 + 1) {
            local_fa8 = local_2548 + (long)local_2538 * 2 + (long)local_2604 * 2 +
                        (long)(local_2684 * local_10ac) * 2;
            src_24[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_24[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_24[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_24[1] = in_stack_ffffffffffffd800;
            src_24[2]._0_4_ = in_stack_ffffffffffffd808;
            src_24[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_24[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_24[3] = in_stack_ffffffffffffd810;
            dgd_40[0]._2_2_ = uVar50;
            dgd_40[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_40[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_40[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_40[1] = in_stack_ffffffffffffd7e0;
            dgd_40[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_40[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_40[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_40[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_24,dgd_40,in_stack_ffffffffffffd7d0);
          }
          local_2604 = local_2604 + 0x10;
        }
        if (local_10d4 != 0) {
          local_fb0 = (undefined1 (*) [32])(local_2550 + (long)local_2604 * 2);
          local_e40 = *(undefined8 *)*local_fb0;
          uStack_e38 = *(undefined8 *)(*local_fb0 + 8);
          uStack_e30 = *(undefined8 *)(*local_fb0 + 0x10);
          uStack_e28 = *(undefined8 *)(*local_fb0 + 0x18);
          local_e60 = local_1100;
          uStack_e58 = uStack_10f8;
          uStack_e50 = uStack_10f0;
          uStack_e48 = uStack_10e8;
          auVar2._8_8_ = uStack_10f8;
          auVar2._0_8_ = local_1100;
          auVar2._16_8_ = uStack_10f0;
          auVar2._24_8_ = uStack_10e8;
          auVar40 = vpand_avx2(*local_fb0,auVar2);
          local_2700 = auVar40._0_8_;
          uStack_26f8 = auVar40._8_8_;
          uStack_26f0 = auVar40._16_8_;
          uStack_26e8 = auVar40._24_8_;
          local_6a0 = local_2700;
          uStack_698 = uStack_26f8;
          uStack_690 = uStack_26f0;
          uStack_688 = uStack_26e8;
          auVar13._16_8_ = uStack_2630;
          auVar13._0_16_ = auVar42._0_16_;
          auVar13._24_8_ = uStack_2628;
          in_stack_ffffffffffffd8e0 = vpmullw_avx2(auVar40,auVar13);
          for (local_2724 = 0; local_6c0 = auVar42._0_16_, auStack_6b0 = auVar42._16_16_,
              local_2724 < 5; local_2724 = local_2724 + 1) {
            local_fb8 = local_2548 + (long)local_2538 * 2 + (long)local_2604 * 2 +
                        (long)(local_2724 * local_10ac) * 2;
            src_25[0]._4_2_ = in_stack_ffffffffffffd7fc;
            src_25[0]._0_4_ = in_stack_ffffffffffffd7f8;
            src_25[0]._6_2_ = in_stack_ffffffffffffd7fe;
            src_25[1] = in_stack_ffffffffffffd800;
            src_25[2]._0_4_ = in_stack_ffffffffffffd808;
            src_25[2]._4_2_ = in_stack_ffffffffffffd80c;
            src_25[2]._6_2_ = in_stack_ffffffffffffd80e;
            src_25[3] = in_stack_ffffffffffffd810;
            dgd_41[0]._2_2_ = uVar50;
            dgd_41[0]._0_2_ = in_stack_ffffffffffffd7d8;
            dgd_41[0]._4_2_ = in_stack_ffffffffffffd7dc;
            dgd_41[0]._6_2_ = in_stack_ffffffffffffd7de;
            dgd_41[1] = in_stack_ffffffffffffd7e0;
            dgd_41[2]._0_4_ = in_stack_ffffffffffffd7e8;
            dgd_41[2]._4_2_ = in_stack_ffffffffffffd7ec;
            dgd_41[2]._6_2_ = in_stack_ffffffffffffd7ee;
            dgd_41[3] = in_stack_ffffffffffffd7f0;
            madd_and_accum_avx2(src_25,dgd_41,in_stack_ffffffffffffd7d0);
            auVar42._0_16_ = local_6c0;
            auVar42._16_16_ = auStack_6b0;
          }
        }
        local_253c = local_1104 + local_253c;
        local_2548 = local_2548 + (long)(int)(local_1104 * local_10ac) * 2;
        local_2550 = local_2550 + (long)(int)(local_1104 * local_10ac) * 2;
      } while (local_253c < in_stack_00000008);
      iStack_25f0 = 0;
      iStack_25e8 = 0;
      src0_14[1] = in_stack_ffffffffffffd860;
      src0_14[0] = uVar51;
      src0_14[2] = in_stack_ffffffffffffd868;
      src0_14[3] = lStack_2570;
      src1_14[1] = in_stack_ffffffffffffd840._0_8_;
      src1_14[2] = in_stack_ffffffffffffd840._8_8_;
      src1_14[0] = uVar52;
      src1_14[3] = lVar53;
      hadd_four_32_to_64_avx2(src0_14,src1_14,src2,src3);
      local_b48 = M + (long)(local_2534 * 0x19) + (long)(local_1108 * 5);
      *local_b48 = iVar38;
      local_b48[1] = iVar45;
      local_b48[2] = iStack_25f0;
      local_b48[3] = iStack_25e8;
      uStack_2578 = 0;
      lStack_2570 = 0;
      src_26[0]._4_2_ = in_stack_ffffffffffffd7fc;
      src_26[0]._0_4_ = in_stack_ffffffffffffd7f8;
      src_26[0]._6_2_ = in_stack_ffffffffffffd7fe;
      src_26[1] = in_stack_ffffffffffffd800;
      src_26[2]._0_4_ = in_stack_ffffffffffffd808;
      src_26[2]._4_2_ = in_stack_ffffffffffffd80c;
      src_26[2]._6_2_ = in_stack_ffffffffffffd80e;
      src_26[3] = in_stack_ffffffffffffd810;
      local_b80 = iVar38;
      iStack_b78 = iVar45;
      iStack_b70 = iStack_25f0;
      iStack_b68 = iStack_25e8;
      convert_and_add_avx2(src_26);
      src0_15[1] = local_2580;
      src0_15[0] = uVar51;
      src0_15[2] = uStack_2578;
      src0_15[3] = lStack_2570;
      src1_15[1] = in_stack_ffffffffffffd840._0_8_;
      src1_15[2] = in_stack_ffffffffffffd840._8_8_;
      src1_15[0] = uVar52;
      src1_15[3] = lVar53;
      in_stack_ffffffffffffd860 = local_2580;
      in_stack_ffffffffffffd868 = uStack_2578;
      add_64bit_lvl_avx2(src0_15,src1_15);
      local_d8 = M + (long)(local_2534 * 0x19) + (long)(local_1108 * 5) + 4;
      *local_d8 = local_2580;
      local_2538 = local_2538 + 1;
      local_1108 = local_1108 + 1;
      lVar53 = local_2580;
      local_f0 = local_2580;
      uStack_e8 = uStack_2578;
    } while (local_1108 < 5);
  }
  fill_lower_triag_elements_avx2(in_stack_ffffffffffffd8e0._20_4_,in_stack_ffffffffffffd8e0._8_8_);
  return;
}

Assistant:

static void compute_stats_win5_avx2(const int16_t *const d, int32_t d_stride,
                                    const int16_t *const s, int32_t s_stride,
                                    int32_t width, int v_start, int v_end,
                                    int64_t *const M, int64_t *const H,
                                    int use_downsampled_wiener_stats) {
  const int32_t wiener_win = WIENER_WIN_CHROMA;
  const int32_t wiener_win2 = wiener_win * wiener_win;
  // Amount of width which is beyond multiple of 16. This case is handled
  // appropriately to process only the required width towards the end.
  const int32_t wd_mul16 = width & ~15;
  const int32_t wd_beyond_mul16 = width - wd_mul16;
  const __m256i mask =
      _mm256_loadu_si256((__m256i *)(&mask_16bit[16 - wd_beyond_mul16]));
  int downsample_factor;

  // Step 1: Full M (i.e., M0 to M24) and first row H (i.e., H00 to H024)
  // values are filled here. Here, the loop over 'j' is executed for values 0
  // to 4 (wiener_win-1). When the loop executed for a specific 'j', 5 values of
  // M and H are filled as shown below.
  // j=0: M0-M4 and H00-H04, j=1: M5-M9 and H05-H09 are filled etc,.
  int j = 0;
  do {
    const int16_t *s_t = s;
    const int16_t *d_t = d;
    __m256i sum_m[WIENER_WIN_CHROMA] = { _mm256_setzero_si256() };
    __m256i sum_h[WIENER_WIN_CHROMA] = { _mm256_setzero_si256() };
    downsample_factor =
        use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
    int proc_ht = v_start;
    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i src = _mm256_loadu_si256((__m256i *)(s_t + proc_wd));
        const __m256i dgd = _mm256_loadu_si256((__m256i *)(d_t + proc_wd));
        const __m256i src_mul_df = _mm256_mullo_epi16(src, df_reg);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_MH_VALUES(d_t + j + proc_wd)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i src = _mm256_loadu_si256((__m256i *)(s_t + proc_wd));
        const __m256i dgd = _mm256_loadu_si256((__m256i *)(d_t + proc_wd));
        const __m256i src_mask = _mm256_and_si256(src, mask);
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i src_mul_df = _mm256_mullo_epi16(src_mask, df_reg);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_MH_VALUES(d_t + j + proc_wd)
      }
      proc_ht += downsample_factor;
      s_t += downsample_factor * s_stride;
      d_t += downsample_factor * d_stride;
    } while (proc_ht < v_end);

    const __m256i s_m =
        hadd_four_32_to_64_avx2(sum_m[0], sum_m[1], &sum_m[2], &sum_m[3]);
    const __m128i s_m_h = convert_32_to_64_add_avx2(sum_m[4], sum_h[4]);
    _mm256_storeu_si256((__m256i *)(M + wiener_win * j), s_m);
    _mm_storel_epi64((__m128i *)&M[wiener_win * j + 4], s_m_h);

    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + wiener_win * j), s_h);
    _mm_storeh_epi64((__m128i *)&H[wiener_win * j + 4], s_m_h);
  } while (++j < wiener_win);

  // The below steps are designed to fill remaining rows of H buffer. Here, aim
  // is to fill only upper triangle elements correspond to each row and lower
  // triangle elements are copied from upper-triangle elements. Also, as
  // mentioned in Step 1, the core function is designed to fill 5
  // elements/stats/values of H buffer.
  //
  // Step 2: Here, the rows 1, 6, 11, 16 and 21 are filled. As we need to fill
  // only upper-triangle elements, H10 from row1, H60-H64 and H65 from row6,etc,
  // are need not be filled. As the core function process 5 values, in first
  // iteration of 'j' only 4 values to be filled i.e., H11-H14 from row1,H66-H69
  // from row6, etc.
  for (int i = 1; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN_CHROMA)

    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (1 * d_stride), 4)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (1 * d_stride), 4)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + i), s_h);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN5
  }

  // Step 3: Here, the rows 2, 7, 12, 17 and 22 are filled. As we need to fill
  // only upper-triangle elements, H20-H21 from row2, H70-H74 and H75-H76 from
  // row7, etc, are need not be filled. As the core function process 5 values,
  // in first iteration of 'j' only 3 values to be filled i.e., H22-H24 from
  // row2, H77-H79 from row7, etc.
  for (int i = 2; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN_CHROMA)

    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (2 * d_stride), 3)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (2 * d_stride), 3)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m256i s_h =
        hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
    _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + i), s_h);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN5
  }

  // Step 4: Here, the rows 3, 8, 13, 18 and 23 are filled. As we need to fill
  // only upper-triangle elements, H30-H32 from row3, H80-H84 and H85-H87 from
  // row8, etc, are need not be filled. As the core function process 5 values,
  // in first iteration of 'j' only 2 values to be filled i.e., H33-H34 from
  // row3, H88-89 from row8, etc.
  for (int i = 3; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN_CHROMA)

    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (3 * d_stride), 2)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (3 * d_stride), 2)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m128i s_h = convert_32_to_64_add_avx2(sum_h[0], sum_h[1]);
    _mm_storeu_si128((__m128i *)(H + (i * wiener_win2) + i), s_h);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN5
  }

  // Step 5: Here, the rows 4, 9, 14, 19 and 24 are filled. As we need to fill
  // only upper-triangle elements, H40-H43 from row4, H90-H94 and H95-H98 from
  // row9, etc, are need not be filled. As the core function process 5 values,
  // in first iteration of 'j' only 1 values to be filled i.e., H44 from row4,
  // H99 from row9, etc.
  for (int i = 4; i < wiener_win2; i += wiener_win) {
    // Update the dgd pointers appropriately and also derive the 'j'th iteration
    // from where the H buffer filling needs to be started.
    INITIALIZATION(WIENER_WIN_CHROMA)
    do {
      UPDATE_DOWNSAMPLE_FACTOR

      // Process the amount of width multiple of 16.
      while (proc_wd < wd_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (4 * d_stride), 1)

        proc_wd += 16;
      }

      // Process the remaining width here.
      if (wd_beyond_mul16) {
        const __m256i dgd =
            _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
        const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
        const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
        INIT_H_VALUES(d_window + proc_wd + (4 * d_stride), 1)
      }
      proc_ht += downsample_factor;
      d_window += downsample_factor * d_stride;
      d_current_row += downsample_factor * d_stride;
    } while (proc_ht < v_end);
    const __m128i s_h = convert_32_to_64_add_avx2(sum_h[0], sum_h[1]);
    _mm_storeu_si128((__m128i *)(H + (i * wiener_win2) + i), s_h);

    // process the remaining 'j' iterations.
    j++;
    CALCULATE_REMAINING_H_WIN5
  }

  // Step 6: Here, the rows 5, 10, 15 and 20 are filled. As we need to fill only
  // upper-triangle elements, H50-H54 from row5, H100-H104 and H105-H109 from
  // row10,etc, are need not be filled. The first iteration of 'j' fills H55-H59
  // from row5 and H1010-H1014 from row10, etc.
  for (int i = 5; i < wiener_win2; i += wiener_win) {
    // Derive j'th iteration from where the H buffer filling needs to be
    // started.
    j = i / wiener_win;
    int shift = 0;
    do {
      // Update the dgd pointers appropriately.
      int proc_ht = v_start;
      const int16_t *d_window = d + (i / wiener_win);
      const int16_t *d_current_row =
          d + (i / wiener_win) + ((i % wiener_win) * d_stride);
      downsample_factor =
          use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
      __m256i sum_h[WIENER_WIN_CHROMA] = { _mm256_setzero_si256() };
      do {
        UPDATE_DOWNSAMPLE_FACTOR

        // Process the amount of width multiple of 16.
        while (proc_wd < wd_mul16) {
          const __m256i dgd =
              _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
          const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd, df_reg);
          INIT_H_VALUES(d_window + shift + proc_wd, 5)

          proc_wd += 16;
        }

        // Process the remaining width here.
        if (wd_beyond_mul16) {
          const __m256i dgd =
              _mm256_loadu_si256((__m256i *)(d_current_row + proc_wd));
          const __m256i dgd_mask = _mm256_and_si256(dgd, mask);
          const __m256i dgd_mul_df = _mm256_mullo_epi16(dgd_mask, df_reg);
          INIT_H_VALUES(d_window + shift + proc_wd, 5)
        }
        proc_ht += downsample_factor;
        d_window += downsample_factor * d_stride;
        d_current_row += downsample_factor * d_stride;
      } while (proc_ht < v_end);

      const __m256i s_h =
          hadd_four_32_to_64_avx2(sum_h[0], sum_h[1], &sum_h[2], &sum_h[3]);
      _mm256_storeu_si256((__m256i *)(H + (i * wiener_win2) + (wiener_win * j)),
                          s_h);
      const __m256i s_m_h = convert_and_add_avx2(sum_h[4]);
      const __m128i s_m_h0 = add_64bit_lvl_avx2(s_m_h, s_m_h);
      _mm_storel_epi64(
          (__m128i *)(H + (i * wiener_win2) + (wiener_win * j) + 4), s_m_h0);
      shift++;
    } while (++j < wiener_win);
  }

  fill_lower_triag_elements_avx2(wiener_win2, H);
}